

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::sse2::CurveNiIntersector1<4>::
     intersect_t<embree::sse2::SweepCurve1Intersector1<embree::BezierCurveT>,embree::sse2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  Primitive *pPVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  Primitive PVar8;
  Geometry *pGVar9;
  __int_type_conflict _Var10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined6 uVar27;
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  int iVar43;
  undefined4 uVar44;
  undefined4 uVar45;
  StackEntry *pSVar46;
  RTCRayN *extraout_RAX;
  RTCRayN *extraout_RAX_00;
  RTCRayN *pRVar47;
  int iVar48;
  RTCFilterFunctionN p_Var49;
  RTCFilterFunctionN p_Var50;
  RTCFilterFunctionN extraout_RDX;
  RTCFilterFunctionN extraout_RDX_00;
  RTCFilterFunctionN extraout_RDX_01;
  RTCFilterFunctionN extraout_RDX_02;
  RTCFilterFunctionN extraout_RDX_03;
  RTCFilterFunctionN extraout_RDX_04;
  RTCFilterFunctionN p_Var51;
  ulong uVar52;
  ulong uVar53;
  long lVar54;
  bool bVar55;
  uint uVar56;
  uint uVar57;
  uint uVar58;
  uint uVar59;
  uint uVar60;
  uint uVar61;
  uint uVar62;
  uint uVar63;
  short sVar64;
  float fVar65;
  float fVar105;
  float fVar106;
  __m128 a_1;
  undefined2 uVar104;
  undefined1 auVar66 [16];
  undefined1 auVar68 [16];
  undefined1 auVar71 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar78 [16];
  undefined1 auVar81 [16];
  undefined1 auVar84 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  float fVar107;
  undefined8 uVar108;
  float fVar132;
  vfloat4 v;
  float fVar131;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  float fVar133;
  float fVar141;
  float fVar142;
  float fVar143;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  float fVar144;
  float fVar161;
  float fVar162;
  vfloat4 v_1;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  float fVar163;
  float fVar173;
  float fVar174;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  float fVar175;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar171 [16];
  float fVar176;
  float fVar177;
  float fVar207;
  float fVar209;
  undefined1 auVar178 [16];
  undefined1 auVar181 [16];
  undefined1 auVar184 [16];
  undefined1 auVar187 [16];
  undefined1 auVar190 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar197 [16];
  float fVar208;
  float fVar210;
  float fVar211;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar204 [16];
  undefined1 auVar206 [16];
  float fVar212;
  float fVar213;
  float fVar222;
  float fVar224;
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  float fVar223;
  float fVar225;
  float fVar226;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  float fVar227;
  float fVar228;
  float fVar231;
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar235;
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  float fVar236;
  float fVar237;
  float fVar251;
  float fVar253;
  undefined1 auVar238 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  float fVar252;
  float fVar254;
  float fVar255;
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar249;
  undefined1 auVar250 [16];
  float fVar256;
  float fVar257;
  float fVar263;
  float fVar266;
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  float fVar264;
  float fVar265;
  float fVar267;
  float fVar268;
  float fVar269;
  float fVar270;
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  float fVar271;
  float fVar272;
  float fVar273;
  float fVar275;
  float fVar276;
  float fVar277;
  float fVar278;
  float fVar279;
  float fVar280;
  float fVar281;
  float fVar282;
  undefined1 auVar274 [16];
  float fVar283;
  float fVar291;
  float fVar294;
  vfloat4 a;
  float fVar296;
  undefined1 auVar286 [16];
  float fVar284;
  float fVar285;
  float fVar292;
  float fVar293;
  float fVar295;
  float fVar297;
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  float fVar298;
  float fVar299;
  float fVar300;
  float fVar305;
  float fVar308;
  float fVar311;
  undefined1 auVar301 [16];
  float fVar306;
  float fVar307;
  float fVar309;
  float fVar310;
  float fVar312;
  float fVar313;
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  float fVar314;
  float fVar315;
  float fVar316;
  float fVar319;
  float fVar320;
  float fVar321;
  uint uVar322;
  float fVar323;
  float fVar324;
  float fVar325;
  float fVar326;
  float fVar327;
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  uint uVar328;
  float fVar329;
  float fVar334;
  float fVar335;
  float fVar336;
  float fVar337;
  float fVar338;
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  float fVar339;
  float fVar340;
  float fVar341;
  float fVar342;
  uint local_60c;
  undefined8 local_5e8;
  undefined8 local_5c8;
  undefined1 local_5a8 [8];
  float fStack_5a0;
  float fStack_59c;
  RTCFilterFunctionNArguments args;
  int local_4fc;
  undefined1 local_4f8 [8];
  float fStack_4f0;
  float fStack_4ec;
  float local_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float fStack_4dc;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_4d8;
  float local_4c8;
  float fStack_4c4;
  float fStack_4c0;
  float fStack_4bc;
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  vfloatx vu0;
  undefined1 local_3a8 [8];
  float fStack_3a0;
  float fStack_39c;
  undefined1 local_348 [16];
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  undefined1 local_318 [16];
  Primitive *local_300;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  undefined1 local_2c8 [16];
  BBox<embree::vfloat_impl<4>_> tp1;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  BBox<embree::vfloat_impl<4>_> tp0;
  float local_118 [4];
  undefined1 local_108 [16];
  StackEntry stack [4];
  undefined1 auVar67 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 uVar103;
  undefined1 auVar170 [16];
  undefined1 auVar172 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar203 [16];
  undefined1 auVar205 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar287 [16];
  
  PVar8 = prim[1];
  uVar52 = (ulong)(byte)PVar8;
  pPVar5 = prim + uVar52 * 0x19 + 6;
  fVar132 = *(float *)(pPVar5 + 0xc);
  fVar144 = ((ray->super_RayK<1>).org.field_0.m128[0] - *(float *)pPVar5) * fVar132;
  fVar161 = ((ray->super_RayK<1>).org.field_0.m128[1] - *(float *)(pPVar5 + 4)) * fVar132;
  fVar162 = ((ray->super_RayK<1>).org.field_0.m128[2] - *(float *)(pPVar5 + 8)) * fVar132;
  fVar107 = fVar132 * (ray->super_RayK<1>).dir.field_0.m128[0];
  fVar131 = fVar132 * (ray->super_RayK<1>).dir.field_0.m128[1];
  fVar132 = fVar132 * (ray->super_RayK<1>).dir.field_0.m128[2];
  uVar45 = *(undefined4 *)(prim + uVar52 * 4 + 6);
  uVar103 = (undefined1)((uint)uVar45 >> 0x18);
  uVar104 = CONCAT11(uVar103,uVar103);
  uVar103 = (undefined1)((uint)uVar45 >> 0x10);
  uVar108 = CONCAT35(CONCAT21(uVar104,uVar103),CONCAT14(uVar103,uVar45));
  uVar103 = (undefined1)((uint)uVar45 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar108 >> 0x20),uVar103),uVar103);
  sVar64 = CONCAT11((char)uVar45,(char)uVar45);
  uVar53 = CONCAT62(uVar27,sVar64);
  auVar244._8_4_ = 0;
  auVar244._0_8_ = uVar53;
  auVar244._12_2_ = uVar104;
  auVar244._14_2_ = uVar104;
  uVar104 = (undefined2)((ulong)uVar108 >> 0x20);
  auVar259._12_4_ = auVar244._12_4_;
  auVar259._8_2_ = 0;
  auVar259._0_8_ = uVar53;
  auVar259._10_2_ = uVar104;
  auVar74._10_6_ = auVar259._10_6_;
  auVar74._8_2_ = uVar104;
  auVar74._0_8_ = uVar53;
  uVar104 = (undefined2)uVar27;
  auVar28._4_8_ = auVar74._8_8_;
  auVar28._2_2_ = uVar104;
  auVar28._0_2_ = uVar104;
  fVar133 = (float)((int)sVar64 >> 8);
  fVar141 = (float)(auVar28._0_4_ >> 0x18);
  fVar142 = (float)(auVar74._8_4_ >> 0x18);
  uVar45 = *(undefined4 *)(prim + uVar52 * 5 + 6);
  uVar103 = (undefined1)((uint)uVar45 >> 0x18);
  uVar104 = CONCAT11(uVar103,uVar103);
  uVar103 = (undefined1)((uint)uVar45 >> 0x10);
  uVar108 = CONCAT35(CONCAT21(uVar104,uVar103),CONCAT14(uVar103,uVar45));
  uVar103 = (undefined1)((uint)uVar45 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar108 >> 0x20),uVar103),uVar103);
  sVar64 = CONCAT11((char)uVar45,(char)uVar45);
  uVar53 = CONCAT62(uVar27,sVar64);
  auVar288._8_4_ = 0;
  auVar288._0_8_ = uVar53;
  auVar288._12_2_ = uVar104;
  auVar288._14_2_ = uVar104;
  uVar104 = (undefined2)((ulong)uVar108 >> 0x20);
  auVar67._12_4_ = auVar288._12_4_;
  auVar67._8_2_ = 0;
  auVar67._0_8_ = uVar53;
  auVar67._10_2_ = uVar104;
  auVar66._10_6_ = auVar67._10_6_;
  auVar66._8_2_ = uVar104;
  auVar66._0_8_ = uVar53;
  uVar104 = (undefined2)uVar27;
  auVar29._4_8_ = auVar66._8_8_;
  auVar29._2_2_ = uVar104;
  auVar29._0_2_ = uVar104;
  fVar163 = (float)((int)sVar64 >> 8);
  fVar173 = (float)(auVar29._0_4_ >> 0x18);
  fVar174 = (float)(auVar66._8_4_ >> 0x18);
  uVar45 = *(undefined4 *)(prim + uVar52 * 6 + 6);
  uVar103 = (undefined1)((uint)uVar45 >> 0x18);
  uVar104 = CONCAT11(uVar103,uVar103);
  uVar103 = (undefined1)((uint)uVar45 >> 0x10);
  uVar108 = CONCAT35(CONCAT21(uVar104,uVar103),CONCAT14(uVar103,uVar45));
  uVar103 = (undefined1)((uint)uVar45 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar108 >> 0x20),uVar103),uVar103);
  sVar64 = CONCAT11((char)uVar45,(char)uVar45);
  uVar53 = CONCAT62(uVar27,sVar64);
  auVar70._8_4_ = 0;
  auVar70._0_8_ = uVar53;
  auVar70._12_2_ = uVar104;
  auVar70._14_2_ = uVar104;
  uVar104 = (undefined2)((ulong)uVar108 >> 0x20);
  auVar69._12_4_ = auVar70._12_4_;
  auVar69._8_2_ = 0;
  auVar69._0_8_ = uVar53;
  auVar69._10_2_ = uVar104;
  auVar68._10_6_ = auVar69._10_6_;
  auVar68._8_2_ = uVar104;
  auVar68._0_8_ = uVar53;
  uVar104 = (undefined2)uVar27;
  auVar30._4_8_ = auVar68._8_8_;
  auVar30._2_2_ = uVar104;
  auVar30._0_2_ = uVar104;
  fVar227 = (float)((int)sVar64 >> 8);
  fVar231 = (float)(auVar30._0_4_ >> 0x18);
  fVar233 = (float)(auVar68._8_4_ >> 0x18);
  uVar45 = *(undefined4 *)(prim + uVar52 * 0xb + 6);
  uVar103 = (undefined1)((uint)uVar45 >> 0x18);
  uVar104 = CONCAT11(uVar103,uVar103);
  uVar103 = (undefined1)((uint)uVar45 >> 0x10);
  uVar108 = CONCAT35(CONCAT21(uVar104,uVar103),CONCAT14(uVar103,uVar45));
  uVar103 = (undefined1)((uint)uVar45 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar108 >> 0x20),uVar103),uVar103);
  sVar64 = CONCAT11((char)uVar45,(char)uVar45);
  uVar53 = CONCAT62(uVar27,sVar64);
  auVar73._8_4_ = 0;
  auVar73._0_8_ = uVar53;
  auVar73._12_2_ = uVar104;
  auVar73._14_2_ = uVar104;
  uVar104 = (undefined2)((ulong)uVar108 >> 0x20);
  auVar72._12_4_ = auVar73._12_4_;
  auVar72._8_2_ = 0;
  auVar72._0_8_ = uVar53;
  auVar72._10_2_ = uVar104;
  auVar71._10_6_ = auVar72._10_6_;
  auVar71._8_2_ = uVar104;
  auVar71._0_8_ = uVar53;
  uVar104 = (undefined2)uVar27;
  auVar31._4_8_ = auVar71._8_8_;
  auVar31._2_2_ = uVar104;
  auVar31._0_2_ = uVar104;
  fVar65 = (float)((int)sVar64 >> 8);
  fVar105 = (float)(auVar31._0_4_ >> 0x18);
  fVar106 = (float)(auVar71._8_4_ >> 0x18);
  uVar45 = *(undefined4 *)(prim + uVar52 * 0xc + 6);
  uVar103 = (undefined1)((uint)uVar45 >> 0x18);
  uVar104 = CONCAT11(uVar103,uVar103);
  uVar103 = (undefined1)((uint)uVar45 >> 0x10);
  uVar108 = CONCAT35(CONCAT21(uVar104,uVar103),CONCAT14(uVar103,uVar45));
  uVar103 = (undefined1)((uint)uVar45 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar108 >> 0x20),uVar103),uVar103);
  sVar64 = CONCAT11((char)uVar45,(char)uVar45);
  uVar53 = CONCAT62(uVar27,sVar64);
  auVar180._8_4_ = 0;
  auVar180._0_8_ = uVar53;
  auVar180._12_2_ = uVar104;
  auVar180._14_2_ = uVar104;
  uVar104 = (undefined2)((ulong)uVar108 >> 0x20);
  auVar179._12_4_ = auVar180._12_4_;
  auVar179._8_2_ = 0;
  auVar179._0_8_ = uVar53;
  auVar179._10_2_ = uVar104;
  auVar178._10_6_ = auVar179._10_6_;
  auVar178._8_2_ = uVar104;
  auVar178._0_8_ = uVar53;
  uVar104 = (undefined2)uVar27;
  auVar32._4_8_ = auVar178._8_8_;
  auVar32._2_2_ = uVar104;
  auVar32._0_2_ = uVar104;
  fVar212 = (float)((int)sVar64 >> 8);
  fVar222 = (float)(auVar32._0_4_ >> 0x18);
  fVar224 = (float)(auVar178._8_4_ >> 0x18);
  uVar45 = *(undefined4 *)(prim + uVar52 * 0xd + 6);
  uVar103 = (undefined1)((uint)uVar45 >> 0x18);
  uVar104 = CONCAT11(uVar103,uVar103);
  uVar103 = (undefined1)((uint)uVar45 >> 0x10);
  uVar108 = CONCAT35(CONCAT21(uVar104,uVar103),CONCAT14(uVar103,uVar45));
  uVar103 = (undefined1)((uint)uVar45 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar108 >> 0x20),uVar103),uVar103);
  sVar64 = CONCAT11((char)uVar45,(char)uVar45);
  uVar53 = CONCAT62(uVar27,sVar64);
  auVar183._8_4_ = 0;
  auVar183._0_8_ = uVar53;
  auVar183._12_2_ = uVar104;
  auVar183._14_2_ = uVar104;
  uVar104 = (undefined2)((ulong)uVar108 >> 0x20);
  auVar182._12_4_ = auVar183._12_4_;
  auVar182._8_2_ = 0;
  auVar182._0_8_ = uVar53;
  auVar182._10_2_ = uVar104;
  auVar181._10_6_ = auVar182._10_6_;
  auVar181._8_2_ = uVar104;
  auVar181._0_8_ = uVar53;
  uVar104 = (undefined2)uVar27;
  auVar33._4_8_ = auVar181._8_8_;
  auVar33._2_2_ = uVar104;
  auVar33._0_2_ = uVar104;
  fVar256 = (float)((int)sVar64 >> 8);
  fVar263 = (float)(auVar33._0_4_ >> 0x18);
  fVar266 = (float)(auVar181._8_4_ >> 0x18);
  uVar45 = *(undefined4 *)(prim + uVar52 * 0x12 + 6);
  uVar103 = (undefined1)((uint)uVar45 >> 0x18);
  uVar104 = CONCAT11(uVar103,uVar103);
  uVar103 = (undefined1)((uint)uVar45 >> 0x10);
  uVar108 = CONCAT35(CONCAT21(uVar104,uVar103),CONCAT14(uVar103,uVar45));
  uVar103 = (undefined1)((uint)uVar45 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar108 >> 0x20),uVar103),uVar103);
  sVar64 = CONCAT11((char)uVar45,(char)uVar45);
  uVar53 = CONCAT62(uVar27,sVar64);
  auVar186._8_4_ = 0;
  auVar186._0_8_ = uVar53;
  auVar186._12_2_ = uVar104;
  auVar186._14_2_ = uVar104;
  uVar104 = (undefined2)((ulong)uVar108 >> 0x20);
  auVar185._12_4_ = auVar186._12_4_;
  auVar185._8_2_ = 0;
  auVar185._0_8_ = uVar53;
  auVar185._10_2_ = uVar104;
  auVar184._10_6_ = auVar185._10_6_;
  auVar184._8_2_ = uVar104;
  auVar184._0_8_ = uVar53;
  uVar104 = (undefined2)uVar27;
  auVar34._4_8_ = auVar184._8_8_;
  auVar34._2_2_ = uVar104;
  auVar34._0_2_ = uVar104;
  fVar236 = (float)((int)sVar64 >> 8);
  fVar251 = (float)(auVar34._0_4_ >> 0x18);
  fVar253 = (float)(auVar184._8_4_ >> 0x18);
  uVar45 = *(undefined4 *)(prim + uVar52 * 0x13 + 6);
  uVar103 = (undefined1)((uint)uVar45 >> 0x18);
  uVar104 = CONCAT11(uVar103,uVar103);
  uVar103 = (undefined1)((uint)uVar45 >> 0x10);
  uVar108 = CONCAT35(CONCAT21(uVar104,uVar103),CONCAT14(uVar103,uVar45));
  uVar103 = (undefined1)((uint)uVar45 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar108 >> 0x20),uVar103),uVar103);
  sVar64 = CONCAT11((char)uVar45,(char)uVar45);
  uVar53 = CONCAT62(uVar27,sVar64);
  auVar189._8_4_ = 0;
  auVar189._0_8_ = uVar53;
  auVar189._12_2_ = uVar104;
  auVar189._14_2_ = uVar104;
  uVar104 = (undefined2)((ulong)uVar108 >> 0x20);
  auVar188._12_4_ = auVar189._12_4_;
  auVar188._8_2_ = 0;
  auVar188._0_8_ = uVar53;
  auVar188._10_2_ = uVar104;
  auVar187._10_6_ = auVar188._10_6_;
  auVar187._8_2_ = uVar104;
  auVar187._0_8_ = uVar53;
  uVar104 = (undefined2)uVar27;
  auVar35._4_8_ = auVar187._8_8_;
  auVar35._2_2_ = uVar104;
  auVar35._0_2_ = uVar104;
  fVar271 = (float)((int)sVar64 >> 8);
  fVar275 = (float)(auVar35._0_4_ >> 0x18);
  fVar278 = (float)(auVar187._8_4_ >> 0x18);
  uVar45 = *(undefined4 *)(prim + uVar52 * 0x14 + 6);
  uVar103 = (undefined1)((uint)uVar45 >> 0x18);
  uVar104 = CONCAT11(uVar103,uVar103);
  uVar103 = (undefined1)((uint)uVar45 >> 0x10);
  uVar108 = CONCAT35(CONCAT21(uVar104,uVar103),CONCAT14(uVar103,uVar45));
  uVar103 = (undefined1)((uint)uVar45 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar108 >> 0x20),uVar103),uVar103);
  sVar64 = CONCAT11((char)uVar45,(char)uVar45);
  uVar53 = CONCAT62(uVar27,sVar64);
  auVar192._8_4_ = 0;
  auVar192._0_8_ = uVar53;
  auVar192._12_2_ = uVar104;
  auVar192._14_2_ = uVar104;
  uVar104 = (undefined2)((ulong)uVar108 >> 0x20);
  auVar191._12_4_ = auVar192._12_4_;
  auVar191._8_2_ = 0;
  auVar191._0_8_ = uVar53;
  auVar191._10_2_ = uVar104;
  auVar190._10_6_ = auVar191._10_6_;
  auVar190._8_2_ = uVar104;
  auVar190._0_8_ = uVar53;
  uVar104 = (undefined2)uVar27;
  auVar36._4_8_ = auVar190._8_8_;
  auVar36._2_2_ = uVar104;
  auVar36._0_2_ = uVar104;
  fVar314 = (float)((int)sVar64 >> 8);
  fVar319 = (float)(auVar36._0_4_ >> 0x18);
  fVar323 = (float)(auVar190._8_4_ >> 0x18);
  fVar298 = fVar107 * fVar133 + fVar131 * fVar163 + fVar132 * fVar227;
  fVar305 = fVar107 * fVar141 + fVar131 * fVar173 + fVar132 * fVar231;
  fVar308 = fVar107 * fVar142 + fVar131 * fVar174 + fVar132 * fVar233;
  fVar311 = fVar107 * (float)(auVar259._12_4_ >> 0x18) +
            fVar131 * (float)(auVar67._12_4_ >> 0x18) + fVar132 * (float)(auVar69._12_4_ >> 0x18);
  fVar283 = fVar107 * fVar65 + fVar131 * fVar212 + fVar132 * fVar256;
  fVar291 = fVar107 * fVar105 + fVar131 * fVar222 + fVar132 * fVar263;
  fVar294 = fVar107 * fVar106 + fVar131 * fVar224 + fVar132 * fVar266;
  fVar296 = fVar107 * (float)(auVar72._12_4_ >> 0x18) +
            fVar131 * (float)(auVar179._12_4_ >> 0x18) + fVar132 * (float)(auVar182._12_4_ >> 0x18);
  fVar176 = fVar107 * fVar236 + fVar131 * fVar271 + fVar132 * fVar314;
  fVar207 = fVar107 * fVar251 + fVar131 * fVar275 + fVar132 * fVar319;
  fVar209 = fVar107 * fVar253 + fVar131 * fVar278 + fVar132 * fVar323;
  fVar107 = fVar107 * (float)(auVar185._12_4_ >> 0x18) +
            fVar131 * (float)(auVar188._12_4_ >> 0x18) + fVar132 * (float)(auVar191._12_4_ >> 0x18);
  fVar227 = fVar133 * fVar144 + fVar163 * fVar161 + fVar227 * fVar162;
  fVar231 = fVar141 * fVar144 + fVar173 * fVar161 + fVar231 * fVar162;
  fVar233 = fVar142 * fVar144 + fVar174 * fVar161 + fVar233 * fVar162;
  fVar143 = (float)(auVar259._12_4_ >> 0x18) * fVar144 +
            (float)(auVar67._12_4_ >> 0x18) * fVar161 + (float)(auVar69._12_4_ >> 0x18) * fVar162;
  fVar256 = fVar65 * fVar144 + fVar212 * fVar161 + fVar256 * fVar162;
  fVar222 = fVar105 * fVar144 + fVar222 * fVar161 + fVar263 * fVar162;
  fVar224 = fVar106 * fVar144 + fVar224 * fVar161 + fVar266 * fVar162;
  fVar263 = (float)(auVar72._12_4_ >> 0x18) * fVar144 +
            (float)(auVar179._12_4_ >> 0x18) * fVar161 + (float)(auVar182._12_4_ >> 0x18) * fVar162;
  fVar163 = fVar144 * fVar236 + fVar161 * fVar271 + fVar162 * fVar314;
  fVar173 = fVar144 * fVar251 + fVar161 * fVar275 + fVar162 * fVar319;
  fVar174 = fVar144 * fVar253 + fVar161 * fVar278 + fVar162 * fVar323;
  fVar212 = fVar144 * (float)(auVar185._12_4_ >> 0x18) +
            fVar161 * (float)(auVar188._12_4_ >> 0x18) + fVar162 * (float)(auVar191._12_4_ >> 0x18);
  fVar132 = (float)DAT_01f4bd50;
  fVar65 = DAT_01f4bd50._4_4_;
  fVar105 = DAT_01f4bd50._8_4_;
  fVar106 = DAT_01f4bd50._12_4_;
  uVar56 = -(uint)(fVar132 <= ABS(fVar298));
  uVar57 = -(uint)(fVar65 <= ABS(fVar305));
  uVar58 = -(uint)(fVar105 <= ABS(fVar308));
  uVar61 = -(uint)(fVar106 <= ABS(fVar311));
  auVar301._0_4_ = (uint)fVar298 & uVar56;
  auVar301._4_4_ = (uint)fVar305 & uVar57;
  auVar301._8_4_ = (uint)fVar308 & uVar58;
  auVar301._12_4_ = (uint)fVar311 & uVar61;
  auVar145._0_4_ = ~uVar56 & (uint)fVar132;
  auVar145._4_4_ = ~uVar57 & (uint)fVar65;
  auVar145._8_4_ = ~uVar58 & (uint)fVar105;
  auVar145._12_4_ = ~uVar61 & (uint)fVar106;
  auVar145 = auVar145 | auVar301;
  uVar56 = -(uint)(fVar132 <= ABS(fVar283));
  uVar57 = -(uint)(fVar65 <= ABS(fVar291));
  uVar58 = -(uint)(fVar105 <= ABS(fVar294));
  uVar61 = -(uint)(fVar106 <= ABS(fVar296));
  auVar286._0_4_ = (uint)fVar283 & uVar56;
  auVar286._4_4_ = (uint)fVar291 & uVar57;
  auVar286._8_4_ = (uint)fVar294 & uVar58;
  auVar286._12_4_ = (uint)fVar296 & uVar61;
  auVar164._0_4_ = ~uVar56 & (uint)fVar132;
  auVar164._4_4_ = ~uVar57 & (uint)fVar65;
  auVar164._8_4_ = ~uVar58 & (uint)fVar105;
  auVar164._12_4_ = ~uVar61 & (uint)fVar106;
  auVar164 = auVar164 | auVar286;
  uVar56 = -(uint)(fVar132 <= ABS(fVar176));
  uVar57 = -(uint)(fVar65 <= ABS(fVar207));
  uVar58 = -(uint)(fVar105 <= ABS(fVar209));
  uVar61 = -(uint)(fVar106 <= ABS(fVar107));
  auVar193._0_4_ = (uint)fVar176 & uVar56;
  auVar193._4_4_ = (uint)fVar207 & uVar57;
  auVar193._8_4_ = (uint)fVar209 & uVar58;
  auVar193._12_4_ = (uint)fVar107 & uVar61;
  auVar214._0_4_ = ~uVar56 & (uint)fVar132;
  auVar214._4_4_ = ~uVar57 & (uint)fVar65;
  auVar214._8_4_ = ~uVar58 & (uint)fVar105;
  auVar214._12_4_ = ~uVar61 & (uint)fVar106;
  auVar214 = auVar214 | auVar193;
  auVar74 = rcpps(_DAT_01f4bd50,auVar145);
  fVar132 = auVar74._0_4_;
  fVar106 = auVar74._4_4_;
  fVar133 = auVar74._8_4_;
  fVar144 = auVar74._12_4_;
  fVar132 = (1.0 - auVar145._0_4_ * fVar132) * fVar132 + fVar132;
  fVar106 = (1.0 - auVar145._4_4_ * fVar106) * fVar106 + fVar106;
  fVar133 = (1.0 - auVar145._8_4_ * fVar133) * fVar133 + fVar133;
  fVar144 = (1.0 - auVar145._12_4_ * fVar144) * fVar144 + fVar144;
  auVar74 = rcpps(auVar74,auVar164);
  fVar65 = auVar74._0_4_;
  fVar107 = auVar74._4_4_;
  fVar141 = auVar74._8_4_;
  fVar161 = auVar74._12_4_;
  fVar65 = (1.0 - auVar164._0_4_ * fVar65) * fVar65 + fVar65;
  fVar107 = (1.0 - auVar164._4_4_ * fVar107) * fVar107 + fVar107;
  fVar141 = (1.0 - auVar164._8_4_ * fVar141) * fVar141 + fVar141;
  fVar161 = (1.0 - auVar164._12_4_ * fVar161) * fVar161 + fVar161;
  auVar74 = rcpps(auVar74,auVar214);
  fVar105 = auVar74._0_4_;
  fVar131 = auVar74._4_4_;
  fVar142 = auVar74._8_4_;
  fVar162 = auVar74._12_4_;
  fVar105 = (1.0 - auVar214._0_4_ * fVar105) * fVar105 + fVar105;
  fVar131 = (1.0 - auVar214._4_4_ * fVar131) * fVar131 + fVar131;
  fVar142 = (1.0 - auVar214._8_4_ * fVar142) * fVar142 + fVar142;
  fVar162 = (1.0 - auVar214._12_4_ * fVar162) * fVar162 + fVar162;
  uVar53 = *(ulong *)(prim + uVar52 * 7 + 6);
  uVar104 = (undefined2)(uVar53 >> 0x30);
  auVar77._8_4_ = 0;
  auVar77._0_8_ = uVar53;
  auVar77._12_2_ = uVar104;
  auVar77._14_2_ = uVar104;
  uVar104 = (undefined2)(uVar53 >> 0x20);
  auVar76._12_4_ = auVar77._12_4_;
  auVar76._8_2_ = 0;
  auVar76._0_8_ = uVar53;
  auVar76._10_2_ = uVar104;
  auVar75._10_6_ = auVar76._10_6_;
  auVar75._8_2_ = uVar104;
  auVar75._0_8_ = uVar53;
  uVar104 = (undefined2)(uVar53 >> 0x10);
  auVar37._4_8_ = auVar75._8_8_;
  auVar37._2_2_ = uVar104;
  auVar37._0_2_ = uVar104;
  auVar146._0_8_ =
       CONCAT44(((float)(auVar37._0_4_ >> 0x10) - fVar231) * fVar106,
                ((float)(int)(short)uVar53 - fVar227) * fVar132);
  auVar146._8_4_ = ((float)(auVar75._8_4_ >> 0x10) - fVar233) * fVar133;
  auVar146._12_4_ = ((float)(auVar76._12_4_ >> 0x10) - fVar143) * fVar144;
  uVar53 = *(ulong *)(prim + uVar52 * 9 + 6);
  uVar104 = (undefined2)(uVar53 >> 0x30);
  auVar80._8_4_ = 0;
  auVar80._0_8_ = uVar53;
  auVar80._12_2_ = uVar104;
  auVar80._14_2_ = uVar104;
  uVar104 = (undefined2)(uVar53 >> 0x20);
  auVar79._12_4_ = auVar80._12_4_;
  auVar79._8_2_ = 0;
  auVar79._0_8_ = uVar53;
  auVar79._10_2_ = uVar104;
  auVar78._10_6_ = auVar79._10_6_;
  auVar78._8_2_ = uVar104;
  auVar78._0_8_ = uVar53;
  uVar104 = (undefined2)(uVar53 >> 0x10);
  auVar38._4_8_ = auVar78._8_8_;
  auVar38._2_2_ = uVar104;
  auVar38._0_2_ = uVar104;
  auVar215._0_4_ = ((float)(int)(short)uVar53 - fVar227) * fVar132;
  auVar215._4_4_ = ((float)(auVar38._0_4_ >> 0x10) - fVar231) * fVar106;
  auVar215._8_4_ = ((float)(auVar78._8_4_ >> 0x10) - fVar233) * fVar133;
  auVar215._12_4_ = ((float)(auVar79._12_4_ >> 0x10) - fVar143) * fVar144;
  uVar53 = *(ulong *)(prim + uVar52 * 0xe + 6);
  uVar104 = (undefined2)(uVar53 >> 0x30);
  auVar83._8_4_ = 0;
  auVar83._0_8_ = uVar53;
  auVar83._12_2_ = uVar104;
  auVar83._14_2_ = uVar104;
  uVar104 = (undefined2)(uVar53 >> 0x20);
  auVar82._12_4_ = auVar83._12_4_;
  auVar82._8_2_ = 0;
  auVar82._0_8_ = uVar53;
  auVar82._10_2_ = uVar104;
  auVar81._10_6_ = auVar82._10_6_;
  auVar81._8_2_ = uVar104;
  auVar81._0_8_ = uVar53;
  uVar104 = (undefined2)(uVar53 >> 0x10);
  auVar39._4_8_ = auVar81._8_8_;
  auVar39._2_2_ = uVar104;
  auVar39._0_2_ = uVar104;
  auVar134._0_8_ =
       CONCAT44(((float)(auVar39._0_4_ >> 0x10) - fVar222) * fVar107,
                ((float)(int)(short)uVar53 - fVar256) * fVar65);
  auVar134._8_4_ = ((float)(auVar81._8_4_ >> 0x10) - fVar224) * fVar141;
  auVar134._12_4_ = ((float)(auVar82._12_4_ >> 0x10) - fVar263) * fVar161;
  uVar53 = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + 6);
  uVar104 = (undefined2)(uVar53 >> 0x30);
  auVar86._8_4_ = 0;
  auVar86._0_8_ = uVar53;
  auVar86._12_2_ = uVar104;
  auVar86._14_2_ = uVar104;
  uVar104 = (undefined2)(uVar53 >> 0x20);
  auVar85._12_4_ = auVar86._12_4_;
  auVar85._8_2_ = 0;
  auVar85._0_8_ = uVar53;
  auVar85._10_2_ = uVar104;
  auVar84._10_6_ = auVar85._10_6_;
  auVar84._8_2_ = uVar104;
  auVar84._0_8_ = uVar53;
  uVar104 = (undefined2)(uVar53 >> 0x10);
  auVar40._4_8_ = auVar84._8_8_;
  auVar40._2_2_ = uVar104;
  auVar40._0_2_ = uVar104;
  auVar87._0_4_ = ((float)(int)(short)uVar53 - fVar256) * fVar65;
  auVar87._4_4_ = ((float)(auVar40._0_4_ >> 0x10) - fVar222) * fVar107;
  auVar87._8_4_ = ((float)(auVar84._8_4_ >> 0x10) - fVar224) * fVar141;
  auVar87._12_4_ = ((float)(auVar85._12_4_ >> 0x10) - fVar263) * fVar161;
  uVar53 = *(ulong *)(prim + uVar52 * 0x15 + 6);
  uVar104 = (undefined2)(uVar53 >> 0x30);
  auVar196._8_4_ = 0;
  auVar196._0_8_ = uVar53;
  auVar196._12_2_ = uVar104;
  auVar196._14_2_ = uVar104;
  uVar104 = (undefined2)(uVar53 >> 0x20);
  auVar195._12_4_ = auVar196._12_4_;
  auVar195._8_2_ = 0;
  auVar195._0_8_ = uVar53;
  auVar195._10_2_ = uVar104;
  auVar194._10_6_ = auVar195._10_6_;
  auVar194._8_2_ = uVar104;
  auVar194._0_8_ = uVar53;
  uVar104 = (undefined2)(uVar53 >> 0x10);
  auVar41._4_8_ = auVar194._8_8_;
  auVar41._2_2_ = uVar104;
  auVar41._0_2_ = uVar104;
  auVar197._0_8_ =
       CONCAT44(((float)(auVar41._0_4_ >> 0x10) - fVar173) * fVar131,
                ((float)(int)(short)uVar53 - fVar163) * fVar105);
  auVar197._8_4_ = ((float)(auVar194._8_4_ >> 0x10) - fVar174) * fVar142;
  auVar197._12_4_ = ((float)(auVar195._12_4_ >> 0x10) - fVar212) * fVar162;
  uVar53 = *(ulong *)(prim + uVar52 * 0x17 + 6);
  uVar104 = (undefined2)(uVar53 >> 0x30);
  auVar240._8_4_ = 0;
  auVar240._0_8_ = uVar53;
  auVar240._12_2_ = uVar104;
  auVar240._14_2_ = uVar104;
  uVar104 = (undefined2)(uVar53 >> 0x20);
  auVar239._12_4_ = auVar240._12_4_;
  auVar239._8_2_ = 0;
  auVar239._0_8_ = uVar53;
  auVar239._10_2_ = uVar104;
  auVar238._10_6_ = auVar239._10_6_;
  auVar238._8_2_ = uVar104;
  auVar238._0_8_ = uVar53;
  uVar104 = (undefined2)(uVar53 >> 0x10);
  auVar42._4_8_ = auVar238._8_8_;
  auVar42._2_2_ = uVar104;
  auVar42._0_2_ = uVar104;
  auVar241._0_4_ = ((float)(int)(short)uVar53 - fVar163) * fVar105;
  auVar241._4_4_ = ((float)(auVar42._0_4_ >> 0x10) - fVar173) * fVar131;
  auVar241._8_4_ = ((float)(auVar238._8_4_ >> 0x10) - fVar174) * fVar142;
  auVar241._12_4_ = ((float)(auVar239._12_4_ >> 0x10) - fVar212) * fVar162;
  auVar258._8_4_ = auVar146._8_4_;
  auVar258._0_8_ = auVar146._0_8_;
  auVar258._12_4_ = auVar146._12_4_;
  auVar259 = minps(auVar258,auVar215);
  auVar109._8_4_ = auVar134._8_4_;
  auVar109._0_8_ = auVar134._0_8_;
  auVar109._12_4_ = auVar134._12_4_;
  auVar74 = minps(auVar109,auVar87);
  auVar259 = maxps(auVar259,auVar74);
  auVar110._8_4_ = auVar197._8_4_;
  auVar110._0_8_ = auVar197._0_8_;
  auVar110._12_4_ = auVar197._12_4_;
  auVar74 = minps(auVar110,auVar241);
  uVar45 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar165._4_4_ = uVar45;
  auVar165._0_4_ = uVar45;
  auVar165._8_4_ = uVar45;
  auVar165._12_4_ = uVar45;
  auVar74 = maxps(auVar74,auVar165);
  auVar74 = maxps(auVar259,auVar74);
  fVar65 = auVar74._0_4_ * 0.99999964;
  fVar105 = auVar74._4_4_ * 0.99999964;
  fVar106 = auVar74._8_4_ * 0.99999964;
  fVar107 = auVar74._12_4_ * 0.99999964;
  auVar259 = maxps(auVar146,auVar215);
  auVar74 = maxps(auVar134,auVar87);
  auVar74 = minps(auVar259,auVar74);
  auVar259 = maxps(auVar197,auVar241);
  fVar132 = (ray->super_RayK<1>).tfar;
  auVar88._4_4_ = fVar132;
  auVar88._0_4_ = fVar132;
  auVar88._8_4_ = fVar132;
  auVar88._12_4_ = fVar132;
  auVar259 = minps(auVar259,auVar88);
  auVar74 = minps(auVar74,auVar259);
  auVar111._0_4_ = -(uint)(PVar8 != (Primitive)0x0 && fVar65 <= auVar74._0_4_ * 1.0000004);
  auVar111._4_4_ = -(uint)(1 < (byte)PVar8 && fVar105 <= auVar74._4_4_ * 1.0000004);
  auVar111._8_4_ = -(uint)(2 < (byte)PVar8 && fVar106 <= auVar74._8_4_ * 1.0000004);
  auVar111._12_4_ = -(uint)(3 < (byte)PVar8 && fVar107 <= auVar74._12_4_ * 1.0000004);
  uVar56 = movmskps((int)((ulong)(byte)PVar8 * 0x10),auVar111);
  auVar112._0_12_ = mm_lookupmask_ps._240_12_;
  auVar112._12_4_ = 0;
  local_300 = prim;
LAB_00313f29:
  uVar53 = (ulong)uVar56;
  if (uVar53 == 0) {
    return;
  }
  lVar54 = 0;
  if (uVar53 != 0) {
    for (; (uVar56 >> lVar54 & 1) == 0; lVar54 = lVar54 + 1) {
    }
  }
  uVar53 = uVar53 - 1 & uVar53;
  uVar56 = *(uint *)(local_300 + 2);
  uVar57 = *(uint *)(local_300 + lVar54 * 4 + 6);
  pGVar9 = (context->scene->geometries).items[uVar56].ptr;
  _Var10 = pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  uVar52 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 + _Var10 * uVar57);
  p_Var50 = pGVar9[1].intersectionFilterN;
  lVar54 = 0;
  if (uVar53 != 0) {
    for (; (uVar53 >> lVar54 & 1) == 0; lVar54 = lVar54 + 1) {
    }
  }
  lVar54 = *(long *)&pGVar9[1].time_range.upper;
  pfVar1 = (float *)(lVar54 + (long)p_Var50 * uVar52);
  pfVar2 = (float *)(lVar54 + (uVar52 + 1) * (long)p_Var50);
  pfVar3 = (float *)(lVar54 + (uVar52 + 2) * (long)p_Var50);
  pfVar4 = (float *)(lVar54 + (uVar52 + 3) * (long)p_Var50);
  if ((uVar53 != 0) && (uVar52 = uVar53 - 1 & uVar53, uVar52 != 0)) {
    lVar54 = 0;
    if (uVar52 != 0) {
      for (; (uVar52 >> lVar54 & 1) == 0; lVar54 = lVar54 + 1) {
      }
    }
    p_Var50 = (RTCFilterFunctionN)
              ((long)p_Var50 *
              (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                              _Var10 * *(uint *)(local_300 + lVar54 * 4 + 6)));
  }
  fVar132 = (ray->super_RayK<1>).org.field_0.m128[0];
  fVar131 = (ray->super_RayK<1>).org.field_0.m128[1];
  fVar133 = (ray->super_RayK<1>).org.field_0.m128[2];
  local_2e8 = (ray->super_RayK<1>).dir.field_0.m128[0];
  fVar141 = (ray->super_RayK<1>).dir.field_0.m128[1];
  fVar142 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fVar144 = (ray->super_RayK<1>).dir.field_0.m128[3];
  fVar224 = local_2e8 * local_2e8;
  fVar251 = fVar141 * fVar141;
  fVar256 = fVar142 * fVar142;
  fVar144 = fVar144 * fVar144;
  fVar161 = fVar224 + fVar251 + fVar256;
  auVar166._0_8_ = CONCAT44(fVar251 + fVar251 + fVar144,fVar161);
  auVar166._8_4_ = fVar256 + fVar251 + fVar256;
  auVar166._12_4_ = fVar144 + fVar251 + fVar144;
  auVar147._8_4_ = auVar166._8_4_;
  auVar147._0_8_ = auVar166._0_8_;
  auVar147._12_4_ = auVar166._12_4_;
  auVar74 = rcpss(auVar147,auVar166);
  local_4e8 = (2.0 - fVar161 * auVar74._0_4_) * auVar74._0_4_ *
              (((pfVar1[2] + pfVar2[2] + pfVar3[2] + pfVar4[2]) * 0.25 - fVar133) * fVar142 +
              ((pfVar1[1] + pfVar2[1] + pfVar3[1] + pfVar4[1]) * 0.25 - fVar131) * fVar141 +
              ((*pfVar1 + *pfVar2 + *pfVar3 + *pfVar4) * 0.25 - fVar132) * local_2e8);
  local_318 = ZEXT416((uint)local_4e8);
  fVar132 = local_2e8 * local_4e8 + fVar132;
  fVar131 = fVar141 * local_4e8 + fVar131;
  fVar133 = fVar142 * local_4e8 + fVar133;
  fVar162 = *pfVar1 - fVar132;
  fVar163 = pfVar1[1] - fVar131;
  fVar173 = pfVar1[2] - fVar133;
  fVar174 = pfVar1[3] - 0.0;
  fVar143 = *pfVar3 - fVar132;
  fVar176 = pfVar3[1] - fVar131;
  fVar207 = pfVar3[2] - fVar133;
  fVar209 = pfVar3[3] - 0.0;
  fVar212 = *pfVar2 - fVar132;
  fVar227 = pfVar2[1] - fVar131;
  fVar231 = pfVar2[2] - fVar133;
  fVar233 = pfVar2[3] - 0.0;
  fVar132 = *pfVar4 - fVar132;
  fVar131 = pfVar4[1] - fVar131;
  fVar133 = pfVar4[2] - fVar133;
  fVar222 = pfVar4[3] - 0.0;
  fVar236 = fVar224 + fVar256 + fVar251;
  fVar253 = fVar224 + fVar256 + fVar251;
  fVar263 = fVar224 + fVar256 + fVar251;
  fVar224 = fVar224 + fVar256 + fVar251;
  local_2d8 = fVar209;
  fStack_2d4 = fVar209;
  fStack_2d0 = fVar209;
  fStack_2cc = fVar209;
  fStack_2e4 = local_2e8;
  fStack_2e0 = local_2e8;
  fStack_2dc = local_2e8;
  local_2f8 = ABS(fVar236);
  fStack_2f4 = ABS(fVar253);
  fStack_2f0 = ABS(fVar263);
  fStack_2ec = ABS(fVar224);
  pSVar46 = (StackEntry *)0x1;
  local_60c = 1;
  fVar144 = 0.0;
  fVar161 = 1.0;
  p_Var49 = (RTCFilterFunctionN)0x0;
  fStack_4e4 = local_4e8;
  fStack_4e0 = local_4e8;
  fStack_4dc = local_4e8;
  local_4b8 = fVar162;
  fStack_4b4 = fVar163;
  fStack_4b0 = fVar173;
  fStack_4ac = fVar174;
  do {
    fVar323 = fVar161 - fVar144;
    fVar256 = fVar323 * 0.0 + fVar144;
    fVar266 = fVar323 * 0.33333334 + fVar144;
    fVar271 = fVar323 * 0.6666667 + fVar144;
    fVar275 = fVar323 * 1.0 + fVar144;
    fVar284 = 1.0 - fVar256;
    fVar292 = 1.0 - fVar266;
    fVar295 = 1.0 - fVar271;
    fVar297 = 1.0 - fVar275;
    fVar278 = fVar212 * fVar284 + fVar143 * fVar256;
    fVar264 = fVar212 * fVar292 + fVar143 * fVar266;
    fVar267 = fVar212 * fVar295 + fVar143 * fVar271;
    fVar269 = fVar212 * fVar297 + fVar143 * fVar275;
    fVar272 = fVar227 * fVar284 + fVar176 * fVar256;
    fVar276 = fVar227 * fVar292 + fVar176 * fVar266;
    fVar279 = fVar227 * fVar295 + fVar176 * fVar271;
    fVar281 = fVar227 * fVar297 + fVar176 * fVar275;
    fVar251 = fVar231 * fVar284 + fVar207 * fVar256;
    fVar283 = fVar231 * fVar292 + fVar207 * fVar266;
    fVar291 = fVar231 * fVar295 + fVar207 * fVar271;
    fVar294 = fVar231 * fVar297 + fVar207 * fVar275;
    fVar228 = fVar233 * fVar284 + local_2d8 * fVar256;
    fVar232 = fVar233 * fVar292 + fStack_2d4 * fVar266;
    fVar234 = fVar233 * fVar295 + fStack_2d0 * fVar271;
    fVar235 = fVar233 * fVar297 + fStack_2cc * fVar275;
    fVar296 = (fVar162 * fVar284 + fVar212 * fVar256) * fVar284 + fVar256 * fVar278;
    fVar298 = (fVar162 * fVar292 + fVar212 * fVar266) * fVar292 + fVar266 * fVar264;
    fVar305 = (fVar162 * fVar295 + fVar212 * fVar271) * fVar295 + fVar271 * fVar267;
    fVar308 = (fVar162 * fVar297 + fVar212 * fVar275) * fVar297 + fVar275 * fVar269;
    fVar311 = (fVar163 * fVar284 + fVar227 * fVar256) * fVar284 + fVar256 * fVar272;
    fVar314 = (fVar163 * fVar292 + fVar227 * fVar266) * fVar292 + fVar266 * fVar276;
    fVar319 = (fVar163 * fVar295 + fVar227 * fVar271) * fVar295 + fVar271 * fVar279;
    fVar175 = (fVar163 * fVar297 + fVar227 * fVar275) * fVar297 + fVar275 * fVar281;
    fVar177 = (fVar173 * fVar284 + fVar231 * fVar256) * fVar284 + fVar256 * fVar251;
    fVar208 = (fVar173 * fVar292 + fVar231 * fVar266) * fVar292 + fVar266 * fVar283;
    fVar210 = (fVar173 * fVar295 + fVar231 * fVar271) * fVar295 + fVar271 * fVar291;
    fVar211 = (fVar173 * fVar297 + fVar231 * fVar275) * fVar297 + fVar275 * fVar294;
    fVar213 = (fVar174 * fVar284 + fVar233 * fVar256) * fVar284 + fVar256 * fVar228;
    fVar223 = (fVar174 * fVar292 + fVar233 * fVar266) * fVar292 + fVar266 * fVar232;
    fVar225 = (fVar174 * fVar295 + fVar233 * fVar271) * fVar295 + fVar271 * fVar234;
    fVar226 = (fVar174 * fVar297 + fVar233 * fVar275) * fVar297 + fVar275 * fVar235;
    fVar257 = fVar278 * fVar284 + (fVar143 * fVar284 + fVar132 * fVar256) * fVar256;
    fVar265 = fVar264 * fVar292 + (fVar143 * fVar292 + fVar132 * fVar266) * fVar266;
    fVar268 = fVar267 * fVar295 + (fVar143 * fVar295 + fVar132 * fVar271) * fVar271;
    fVar270 = fVar269 * fVar297 + (fVar143 * fVar297 + fVar132 * fVar275) * fVar275;
    fVar273 = fVar272 * fVar284 + (fVar176 * fVar284 + fVar131 * fVar256) * fVar256;
    fVar277 = fVar276 * fVar292 + (fVar176 * fVar292 + fVar131 * fVar266) * fVar266;
    fVar280 = fVar279 * fVar295 + (fVar176 * fVar295 + fVar131 * fVar271) * fVar271;
    fVar282 = fVar281 * fVar297 + (fVar176 * fVar297 + fVar131 * fVar275) * fVar275;
    fVar278 = fVar251 * fVar284 + (fVar207 * fVar284 + fVar133 * fVar256) * fVar256;
    fVar283 = fVar283 * fVar292 + (fVar207 * fVar292 + fVar133 * fVar266) * fVar266;
    fVar291 = fVar291 * fVar295 + (fVar207 * fVar295 + fVar133 * fVar271) * fVar271;
    fVar294 = fVar294 * fVar297 + (fVar207 * fVar297 + fVar133 * fVar275) * fVar275;
    fVar267 = fVar228 * fVar284 + (local_2d8 * fVar284 + fVar222 * fVar256) * fVar256;
    fVar264 = fVar232 * fVar292 + (fStack_2d4 * fVar292 + fVar222 * fVar266) * fVar266;
    fVar234 = fVar234 * fVar295 + (fStack_2d0 * fVar295 + fVar222 * fVar271) * fVar271;
    fVar235 = fVar235 * fVar297 + (fStack_2cc * fVar297 + fVar222 * fVar275) * fVar275;
    fVar315 = fVar284 * fVar296 + fVar256 * fVar257;
    fVar320 = fVar292 * fVar298 + fVar266 * fVar265;
    fVar324 = fVar295 * fVar305 + fVar271 * fVar268;
    fVar326 = fVar297 * fVar308 + fVar275 * fVar270;
    fVar329 = fVar284 * fVar311 + fVar256 * fVar273;
    fVar334 = fVar292 * fVar314 + fVar266 * fVar277;
    fVar335 = fVar295 * fVar319 + fVar271 * fVar280;
    fVar337 = fVar297 * fVar175 + fVar275 * fVar282;
    fVar299 = fVar284 * fVar177 + fVar256 * fVar278;
    fVar306 = fVar292 * fVar208 + fVar266 * fVar283;
    fVar309 = fVar295 * fVar210 + fVar271 * fVar291;
    fVar312 = fVar297 * fVar211 + fVar275 * fVar294;
    fVar251 = fVar323 * 0.11111111;
    fVar285 = fVar284 * fVar213 + fVar256 * fVar267;
    fVar293 = fVar292 * fVar223 + fVar266 * fVar264;
    auVar287._0_8_ = CONCAT44(fVar293,fVar285);
    auVar287._8_4_ = fVar295 * fVar225 + fVar271 * fVar234;
    auVar287._12_4_ = fVar297 * fVar226 + fVar275 * fVar235;
    fVar269 = (fVar257 - fVar296) * 3.0 * fVar251;
    fVar272 = (fVar265 - fVar298) * 3.0 * fVar251;
    fVar276 = (fVar268 - fVar305) * 3.0 * fVar251;
    fVar270 = (fVar270 - fVar308) * 3.0 * fVar251;
    fVar279 = (fVar273 - fVar311) * 3.0 * fVar251;
    fVar281 = (fVar277 - fVar314) * 3.0 * fVar251;
    fVar284 = (fVar280 - fVar319) * 3.0 * fVar251;
    fVar292 = (fVar282 - fVar175) * 3.0 * fVar251;
    fVar175 = (fVar278 - fVar177) * 3.0 * fVar251;
    fVar208 = (fVar283 - fVar208) * 3.0 * fVar251;
    fVar228 = (fVar291 - fVar210) * 3.0 * fVar251;
    fVar232 = (fVar294 - fVar211) * 3.0 * fVar251;
    fVar266 = fVar251 * (fVar264 - fVar223) * 3.0;
    fVar275 = fVar251 * (fVar234 - fVar225) * 3.0;
    fVar283 = fVar251 * (fVar235 - fVar226) * 3.0;
    auVar113._4_4_ = auVar287._8_4_;
    auVar113._0_4_ = fVar293;
    auVar113._8_4_ = auVar287._12_4_;
    auVar113._12_4_ = 0;
    auVar114._0_8_ = CONCAT44(auVar287._8_4_ - fVar275,fVar293 - fVar266);
    auVar114._8_4_ = auVar287._12_4_ - fVar283;
    auVar114._12_4_ = 0;
    local_328._0_4_ = fVar334 - fVar329;
    local_328._4_4_ = fVar335 - fVar334;
    fStack_320 = fVar337 - fVar335;
    fStack_31c = 0.0 - fVar337;
    fVar223 = fVar306 - fVar299;
    fVar225 = fVar309 - fVar306;
    auVar167._4_4_ = fVar225;
    auVar167._0_4_ = fVar223;
    fVar226 = fVar312 - fVar309;
    fVar264 = 0.0 - fVar312;
    fVar294 = fVar279 * fVar223 - fVar175 * (float)local_328._0_4_;
    fVar296 = fVar281 * fVar225 - fVar208 * (float)local_328._4_4_;
    fVar298 = fVar284 * fVar226 - fVar228 * fStack_320;
    fVar305 = fVar292 * fVar264 - fVar232 * fStack_31c;
    local_338 = fVar320 - fVar315;
    fStack_334 = fVar324 - fVar320;
    fStack_330 = fVar326 - fVar324;
    fStack_32c = 0.0 - fVar326;
    auVar167._8_4_ = fVar226;
    auVar167._12_4_ = fVar264;
    fVar308 = fVar175 * local_338 - fVar269 * fVar223;
    fVar311 = fVar208 * fStack_334 - fVar272 * fVar225;
    fVar314 = fVar228 * fStack_330 - fVar276 * fVar226;
    fVar319 = fVar232 * fStack_32c - fVar270 * fVar264;
    fVar177 = fVar269 * (float)local_328._0_4_ - fVar279 * local_338;
    fVar210 = fVar272 * (float)local_328._4_4_ - fVar281 * fStack_334;
    fVar211 = fVar276 * fStack_320 - fVar284 * fStack_330;
    fVar234 = fVar270 * fStack_31c - fVar292 * fStack_32c;
    auVar89._0_4_ = fVar223 * fVar223;
    auVar89._4_4_ = fVar225 * fVar225;
    auVar89._8_4_ = fVar226 * fVar226;
    auVar89._12_4_ = fVar264 * fVar264;
    auVar229._0_4_ =
         local_338 * local_338 + (float)local_328._0_4_ * (float)local_328._0_4_ + auVar89._0_4_;
    auVar229._4_4_ =
         fStack_334 * fStack_334 + (float)local_328._4_4_ * (float)local_328._4_4_ + auVar89._4_4_;
    auVar229._8_4_ = fStack_330 * fStack_330 + fStack_320 * fStack_320 + auVar89._8_4_;
    auVar229._12_4_ = fStack_32c * fStack_32c + fStack_31c * fStack_31c + auVar89._12_4_;
    auVar74 = rcpps(auVar89,auVar229);
    fVar256 = auVar74._0_4_;
    fVar271 = auVar74._4_4_;
    fVar278 = auVar74._8_4_;
    fVar291 = auVar74._12_4_;
    fVar256 = (1.0 - fVar256 * auVar229._0_4_) * fVar256 + fVar256;
    fVar271 = (1.0 - fVar271 * auVar229._4_4_) * fVar271 + fVar271;
    fVar278 = (1.0 - fVar278 * auVar229._8_4_) * fVar278 + fVar278;
    fVar291 = (1.0 - fVar291 * auVar229._12_4_) * fVar291 + fVar291;
    fVar235 = fVar223 * fVar281 - (float)local_328._0_4_ * fVar208;
    fVar257 = fVar225 * fVar284 - (float)local_328._4_4_ * fVar228;
    fVar265 = fVar226 * fVar292 - fStack_320 * fVar232;
    fVar268 = fVar264 * 0.0 - fStack_31c * 0.0;
    fVar273 = local_338 * fVar208 - fVar223 * fVar272;
    fVar277 = fStack_334 * fVar228 - fVar225 * fVar276;
    fVar280 = fStack_330 * fVar232 - fVar226 * fVar270;
    fVar282 = fStack_32c * 0.0 - fVar264 * 0.0;
    fVar295 = (float)local_328._0_4_ * fVar272 - local_338 * fVar281;
    fVar297 = (float)local_328._4_4_ * fVar276 - fStack_334 * fVar284;
    fVar336 = fStack_320 * fVar270 - fStack_330 * fVar292;
    fVar338 = fStack_31c * 0.0 - fStack_32c * 0.0;
    auVar198._0_4_ = (fVar294 * fVar294 + fVar308 * fVar308 + fVar177 * fVar177) * fVar256;
    auVar198._4_4_ = (fVar296 * fVar296 + fVar311 * fVar311 + fVar210 * fVar210) * fVar271;
    auVar198._8_4_ = (fVar298 * fVar298 + fVar314 * fVar314 + fVar211 * fVar211) * fVar278;
    auVar198._12_4_ = (fVar305 * fVar305 + fVar319 * fVar319 + fVar234 * fVar234) * fVar291;
    auVar242._0_4_ = (fVar235 * fVar235 + fVar273 * fVar273 + fVar295 * fVar295) * fVar256;
    auVar242._4_4_ = (fVar257 * fVar257 + fVar277 * fVar277 + fVar297 * fVar297) * fVar271;
    auVar242._8_4_ = (fVar265 * fVar265 + fVar280 * fVar280 + fVar336 * fVar336) * fVar278;
    auVar242._12_4_ = (fVar268 * fVar268 + fVar282 * fVar282 + fVar338 * fVar338) * fVar291;
    auVar259 = maxps(auVar198,auVar242);
    auVar216._8_4_ = auVar287._8_4_;
    auVar216._0_8_ = auVar287._0_8_;
    auVar216._12_4_ = auVar287._12_4_;
    auVar14._4_4_ = fVar293 + fVar266;
    auVar14._0_4_ = fVar285 + fVar251 * (fVar267 - fVar213) * 3.0;
    auVar14._8_4_ = auVar287._8_4_ + fVar275;
    auVar14._12_4_ = auVar287._12_4_ + fVar283;
    auVar74 = maxps(auVar216,auVar14);
    auVar243._8_4_ = auVar114._8_4_;
    auVar243._0_8_ = auVar114._0_8_;
    auVar243._12_4_ = 0;
    auVar244 = maxps(auVar243,auVar113);
    auVar244 = maxps(auVar74,auVar244);
    auVar288 = minps(auVar287,auVar14);
    auVar74 = minps(auVar114,auVar113);
    auVar288 = minps(auVar288,auVar74);
    auVar74 = sqrtps(auVar74,auVar259);
    auVar259 = rsqrtps(auVar167,auVar229);
    fVar251 = auVar259._0_4_;
    fVar256 = auVar259._4_4_;
    fVar266 = auVar259._8_4_;
    fVar275 = auVar259._12_4_;
    fVar271 = fVar251 * fVar251 * auVar229._0_4_ * -0.5 * fVar251 + fVar251 * 1.5;
    fVar291 = fVar256 * fVar256 * auVar229._4_4_ * -0.5 * fVar256 + fVar256 * 1.5;
    fVar305 = fVar266 * fVar266 * auVar229._8_4_ * -0.5 * fVar266 + fVar266 * 1.5;
    fVar319 = fVar275 * fVar275 * auVar229._12_4_ * -0.5 * fVar275 + fVar275 * 1.5;
    fVar177 = 0.0 - fVar329;
    fVar210 = 0.0 - fVar334;
    fVar211 = 0.0 - fVar335;
    fVar213 = 0.0 - fVar337;
    fVar280 = 0.0 - fVar299;
    fVar282 = 0.0 - fVar306;
    fVar285 = 0.0 - fVar309;
    fVar293 = 0.0 - fVar312;
    fVar251 = 0.0 - fVar315;
    fVar275 = 0.0 - fVar320;
    fVar294 = 0.0 - fVar324;
    fVar308 = 0.0 - fVar326;
    auVar25._4_4_ = fStack_2e4;
    auVar25._0_4_ = local_2e8;
    auVar25._8_4_ = fStack_2e0;
    auVar25._12_4_ = fStack_2dc;
    fVar339 = local_2e8 * local_338 * fVar271 +
              fVar141 * (float)local_328._0_4_ * fVar271 + fVar142 * fVar223 * fVar271;
    fVar340 = fStack_2e4 * fStack_334 * fVar291 +
              fVar141 * (float)local_328._4_4_ * fVar291 + fVar142 * fVar225 * fVar291;
    fVar341 = fStack_2e0 * fStack_330 * fVar305 +
              fVar141 * fStack_320 * fVar305 + fVar142 * fVar226 * fVar305;
    fVar342 = fStack_2dc * fStack_32c * fVar319 +
              fVar141 * fStack_31c * fVar319 + fVar142 * fVar264 * fVar319;
    fVar316 = local_338 * fVar271 * fVar251 +
              (float)local_328._0_4_ * fVar271 * fVar177 + fVar223 * fVar271 * fVar280;
    fVar321 = fStack_334 * fVar291 * fVar275 +
              (float)local_328._4_4_ * fVar291 * fVar210 + fVar225 * fVar291 * fVar282;
    fVar325 = fStack_330 * fVar305 * fVar294 +
              fStack_320 * fVar305 * fVar211 + fVar226 * fVar305 * fVar285;
    fVar327 = fStack_32c * fVar319 * fVar308 +
              fStack_31c * fVar319 * fVar213 + fVar264 * fVar319 * fVar293;
    fVar267 = (local_2e8 * fVar251 + fVar141 * fVar177 + fVar142 * fVar280) - fVar339 * fVar316;
    fVar235 = (fStack_2e4 * fVar275 + fVar141 * fVar210 + fVar142 * fVar282) - fVar340 * fVar321;
    fVar265 = (fStack_2e0 * fVar294 + fVar141 * fVar211 + fVar142 * fVar285) - fVar341 * fVar325;
    fVar273 = (fStack_2dc * fVar308 + fVar141 * fVar213 + fVar142 * fVar293) - fVar342 * fVar327;
    fVar266 = (fVar251 * fVar251 + fVar177 * fVar177 + fVar280 * fVar280) - fVar316 * fVar316;
    fVar283 = (fVar275 * fVar275 + fVar210 * fVar210 + fVar282 * fVar282) - fVar321 * fVar321;
    fVar298 = (fVar294 * fVar294 + fVar211 * fVar211 + fVar285 * fVar285) - fVar325 * fVar325;
    fVar314 = (fVar308 * fVar308 + fVar213 * fVar213 + fVar293 * fVar293) - fVar327 * fVar327;
    fVar256 = (auVar244._0_4_ + auVar74._0_4_) * 1.0000002;
    fVar278 = (auVar244._4_4_ + auVar74._4_4_) * 1.0000002;
    fVar296 = (auVar244._8_4_ + auVar74._8_4_) * 1.0000002;
    fVar311 = (auVar244._12_4_ + auVar74._12_4_) * 1.0000002;
    auVar217._0_4_ = fVar256 * fVar256;
    auVar217._4_4_ = fVar278 * fVar278;
    auVar217._8_4_ = fVar296 * fVar296;
    auVar217._12_4_ = fVar311 * fVar311;
    fVar295 = fVar266 - auVar217._0_4_;
    fVar297 = fVar283 - auVar217._4_4_;
    fVar336 = fVar298 - auVar217._8_4_;
    fVar338 = fVar314 - auVar217._12_4_;
    fVar256 = fVar236 - fVar339 * fVar339;
    fVar278 = fVar253 - fVar340 * fVar340;
    fVar296 = fVar263 - fVar341 * fVar341;
    fVar311 = fVar224 - fVar342 * fVar342;
    fVar267 = fVar267 + fVar267;
    fVar235 = fVar235 + fVar235;
    fVar265 = fVar265 + fVar265;
    fVar273 = fVar273 + fVar273;
    auVar115._0_4_ = fVar267 * fVar267 - fVar256 * 4.0 * fVar295;
    auVar115._4_4_ = fVar235 * fVar235 - fVar278 * 4.0 * fVar297;
    auVar115._8_4_ = fVar265 * fVar265 - fVar296 * 4.0 * fVar336;
    auVar115._12_4_ = fVar273 * fVar273 - fVar311 * 4.0 * fVar338;
    local_4f8._4_4_ = (auVar288._4_4_ - auVar74._4_4_) * 0.99999976;
    local_4f8._0_4_ = (auVar288._0_4_ - auVar74._0_4_) * 0.99999976;
    fStack_4f0 = (auVar288._8_4_ - auVar74._8_4_) * 0.99999976;
    fStack_4ec = (auVar288._12_4_ - auVar74._12_4_) * 0.99999976;
    auVar245._0_12_ = ZEXT812(0);
    auVar245._12_4_ = 0;
    auVar199._4_4_ = -(uint)(0.0 <= auVar115._4_4_);
    auVar199._0_4_ = -(uint)(0.0 <= auVar115._0_4_);
    auVar199._8_4_ = -(uint)(0.0 <= auVar115._8_4_);
    auVar199._12_4_ = -(uint)(0.0 <= auVar115._12_4_);
    uVar45 = (undefined4)((ulong)pSVar46 >> 0x20);
    iVar43 = movmskps((int)pSVar46,auVar199);
    auVar289._0_8_ = CONCAT44(fVar340 * fVar340,fVar339 * fVar339) & 0x7fffffff7fffffff;
    auVar289._8_4_ = ABS(fVar341 * fVar341);
    auVar289._12_4_ = ABS(fVar342 * fVar342);
    fVar234 = ABS(fVar256);
    fVar257 = ABS(fVar278);
    fVar268 = ABS(fVar296);
    fVar277 = ABS(fVar311);
    if (iVar43 == 0) {
      iVar43 = 0;
      auVar247 = _DAT_01f45a40;
      auVar317 = _DAT_01f45a30;
    }
    else {
      auVar259 = sqrtps(auVar25,auVar115);
      bVar55 = 0.0 <= auVar115._0_4_;
      uVar58 = -(uint)bVar55;
      bVar11 = 0.0 <= auVar115._4_4_;
      uVar61 = -(uint)bVar11;
      bVar12 = 0.0 <= auVar115._8_4_;
      uVar59 = -(uint)bVar12;
      bVar13 = 0.0 <= auVar115._12_4_;
      uVar62 = -(uint)bVar13;
      auVar218._0_4_ = fVar256 + fVar256;
      auVar218._4_4_ = fVar278 + fVar278;
      auVar218._8_4_ = fVar296 + fVar296;
      auVar218._12_4_ = fVar311 + fVar311;
      auVar74 = rcpps(auVar245,auVar218);
      fVar300 = auVar74._0_4_;
      fVar307 = auVar74._4_4_;
      fVar310 = auVar74._8_4_;
      fVar313 = auVar74._12_4_;
      fVar300 = (1.0 - auVar218._0_4_ * fVar300) * fVar300 + fVar300;
      fVar307 = (1.0 - auVar218._4_4_ * fVar307) * fVar307 + fVar307;
      fVar310 = (1.0 - auVar218._8_4_ * fVar310) * fVar310 + fVar310;
      fVar313 = (1.0 - auVar218._12_4_ * fVar313) * fVar313 + fVar313;
      fVar237 = (-fVar267 - auVar259._0_4_) * fVar300;
      fVar252 = (-fVar235 - auVar259._4_4_) * fVar307;
      fVar254 = (-fVar265 - auVar259._8_4_) * fVar310;
      fVar255 = (-fVar273 - auVar259._12_4_) * fVar313;
      fVar300 = (auVar259._0_4_ - fVar267) * fVar300;
      fVar307 = (auVar259._4_4_ - fVar235) * fVar307;
      fVar310 = (auVar259._8_4_ - fVar265) * fVar310;
      fVar313 = (auVar259._12_4_ - fVar273) * fVar313;
      auVar217._0_4_ = (fVar339 * fVar237 + fVar316) * fVar271;
      auVar217._4_4_ = (fVar340 * fVar252 + fVar321) * fVar291;
      auVar217._8_4_ = (fVar341 * fVar254 + fVar325) * fVar305;
      auVar217._12_4_ = (fVar342 * fVar255 + fVar327) * fVar319;
      local_208 = (fVar339 * fVar300 + fVar316) * fVar271;
      fStack_204 = (fVar340 * fVar307 + fVar321) * fVar291;
      fStack_200 = (fVar341 * fVar310 + fVar325) * fVar305;
      fStack_1fc = (fVar342 * fVar313 + fVar327) * fVar319;
      auVar246._0_4_ = (uint)fVar237 & uVar58;
      auVar246._4_4_ = (uint)fVar252 & uVar61;
      auVar246._8_4_ = (uint)fVar254 & uVar59;
      auVar246._12_4_ = (uint)fVar255 & uVar62;
      auVar317._0_8_ = CONCAT44(~uVar61,~uVar58) & 0x7f8000007f800000;
      auVar317._8_4_ = ~uVar59 & 0x7f800000;
      auVar317._12_4_ = ~uVar62 & 0x7f800000;
      auVar317 = auVar317 | auVar246;
      auVar330._0_4_ = (uint)fVar300 & uVar58;
      auVar330._4_4_ = (uint)fVar307 & uVar61;
      auVar330._8_4_ = (uint)fVar310 & uVar59;
      auVar330._12_4_ = (uint)fVar313 & uVar62;
      auVar247._0_8_ = CONCAT44(~uVar61,~uVar58) & 0xff800000ff800000;
      auVar247._8_4_ = ~uVar59 & 0xff800000;
      auVar247._12_4_ = ~uVar62 & 0xff800000;
      auVar247 = auVar247 | auVar330;
      auVar23._4_4_ = fStack_2f4;
      auVar23._0_4_ = local_2f8;
      auVar23._8_4_ = fStack_2f0;
      auVar23._12_4_ = fStack_2ec;
      auVar74 = maxps(auVar23,auVar289);
      fVar300 = auVar74._0_4_ * 1.9073486e-06;
      fVar237 = auVar74._4_4_ * 1.9073486e-06;
      fVar307 = auVar74._8_4_ * 1.9073486e-06;
      fVar252 = auVar74._12_4_ * 1.9073486e-06;
      auVar331._0_4_ = -(uint)(fVar234 < fVar300 && bVar55);
      auVar331._4_4_ = -(uint)(fVar257 < fVar237 && bVar11);
      auVar331._8_4_ = -(uint)(fVar268 < fVar307 && bVar12);
      auVar331._12_4_ = -(uint)(fVar277 < fVar252 && bVar13);
      iVar43 = movmskps(iVar43,auVar331);
      if (iVar43 != 0) {
        uVar58 = -(uint)(fVar295 <= 0.0);
        uVar61 = -(uint)(fVar297 <= 0.0);
        uVar59 = -(uint)(fVar336 <= 0.0);
        uVar62 = -(uint)(fVar338 <= 0.0);
        local_5e8 = CONCAT44(~uVar61,~uVar58) & 0x7f8000007f800000;
        auVar200._0_4_ = (uVar58 & 0xff800000 | (uint)local_5e8) & auVar331._0_4_;
        auVar200._4_4_ = (uVar61 & 0xff800000 | local_5e8._4_4_) & auVar331._4_4_;
        auVar200._8_4_ = (uVar59 & 0xff800000 | ~uVar59 & 0x7f800000) & auVar331._8_4_;
        auVar200._12_4_ = (uVar62 & 0xff800000 | ~uVar62 & 0x7f800000) & auVar331._12_4_;
        auVar302._0_4_ = ~auVar331._0_4_ & auVar317._0_4_;
        auVar302._4_4_ = ~auVar331._4_4_ & auVar317._4_4_;
        auVar302._8_4_ = ~auVar331._8_4_ & auVar317._8_4_;
        auVar302._12_4_ = ~auVar331._12_4_ & auVar317._12_4_;
        auVar318._0_4_ = (uVar58 & 0x7f800000 | ~uVar58 & 0xff800000) & auVar331._0_4_;
        auVar318._4_4_ = (uVar61 & 0x7f800000 | ~uVar61 & 0xff800000) & auVar331._4_4_;
        auVar318._8_4_ = (uVar59 & 0x7f800000 | ~uVar59 & 0xff800000) & auVar331._8_4_;
        auVar318._12_4_ = (uVar62 & 0x7f800000 | ~uVar62 & 0xff800000) & auVar331._12_4_;
        auVar332._0_4_ = ~auVar331._0_4_ & auVar247._0_4_;
        auVar332._4_4_ = ~auVar331._4_4_ & auVar247._4_4_;
        auVar332._8_4_ = ~auVar331._8_4_ & auVar247._8_4_;
        auVar332._12_4_ = ~auVar331._12_4_ & auVar247._12_4_;
        auVar199._4_4_ = -(uint)((fVar237 <= fVar257 || fVar297 <= 0.0) && bVar11);
        auVar199._0_4_ = -(uint)((fVar300 <= fVar234 || fVar295 <= 0.0) && bVar55);
        auVar199._8_4_ = -(uint)((fVar307 <= fVar268 || fVar336 <= 0.0) && bVar12);
        auVar199._12_4_ = -(uint)((fVar252 <= fVar277 || fVar338 <= 0.0) && bVar13);
        auVar247 = auVar332 | auVar318;
        auVar317 = auVar302 | auVar200;
      }
    }
    auVar201._0_4_ = (auVar199._0_4_ << 0x1f) >> 0x1f;
    auVar201._4_4_ = (auVar199._4_4_ << 0x1f) >> 0x1f;
    auVar201._8_4_ = (auVar199._8_4_ << 0x1f) >> 0x1f;
    auVar201._12_4_ = (auVar199._12_4_ << 0x1f) >> 0x1f;
    auVar201 = auVar201 & auVar112;
    iVar43 = movmskps(iVar43,auVar201);
    pRVar47 = (RTCRayN *)CONCAT44(uVar45,iVar43);
    if (iVar43 != 0) {
      auVar90._0_4_ = (ray->super_RayK<1>).org.field_0.m128[3] - (float)local_318._0_4_;
      auVar90._4_4_ = auVar90._0_4_;
      auVar90._8_4_ = auVar90._0_4_;
      auVar90._12_4_ = auVar90._0_4_;
      auVar74 = maxps(auVar90,auVar317);
      auVar303._0_4_ = (ray->super_RayK<1>).tfar - (float)local_318._0_4_;
      auVar303._4_4_ = auVar303._0_4_;
      auVar303._8_4_ = auVar303._0_4_;
      auVar303._12_4_ = auVar303._0_4_;
      auVar244 = minps(auVar303,auVar247);
      auVar116._0_4_ = fVar279 * fVar141 + fVar175 * fVar142;
      auVar116._4_4_ = fVar281 * fVar141 + fVar208 * fVar142;
      auVar116._8_4_ = fVar284 * fVar141 + fVar228 * fVar142;
      auVar116._12_4_ = fVar292 * fVar141 + fVar232 * fVar142;
      auVar260._0_4_ = fVar269 * local_2e8 + auVar116._0_4_;
      auVar260._4_4_ = fVar272 * fStack_2e4 + auVar116._4_4_;
      auVar260._8_4_ = fVar276 * fStack_2e0 + auVar116._8_4_;
      auVar260._12_4_ = fVar270 * fStack_2dc + auVar116._12_4_;
      auVar259 = rcpps(auVar116,auVar260);
      fVar295 = auVar259._0_4_;
      fVar297 = auVar259._4_4_;
      fVar336 = auVar259._8_4_;
      fVar338 = auVar259._12_4_;
      fVar251 = ((1.0 - auVar260._0_4_ * fVar295) * fVar295 + fVar295) *
                -(fVar251 * fVar269 + fVar177 * fVar279 + fVar280 * fVar175);
      fVar275 = ((1.0 - auVar260._4_4_ * fVar297) * fVar297 + fVar297) *
                -(fVar275 * fVar272 + fVar210 * fVar281 + fVar282 * fVar208);
      fVar294 = ((1.0 - auVar260._8_4_ * fVar336) * fVar336 + fVar336) *
                -(fVar294 * fVar276 + fVar211 * fVar284 + fVar285 * fVar228);
      fVar308 = ((1.0 - auVar260._12_4_ * fVar338) * fVar338 + fVar338) *
                -(fVar308 * fVar270 + fVar213 * fVar292 + fVar293 * fVar232);
      uVar58 = -(uint)(auVar260._0_4_ < 0.0 || ABS(auVar260._0_4_) < 1e-18);
      uVar61 = -(uint)(auVar260._4_4_ < 0.0 || ABS(auVar260._4_4_) < 1e-18);
      uVar59 = -(uint)(auVar260._8_4_ < 0.0 || ABS(auVar260._8_4_) < 1e-18);
      uVar62 = -(uint)(auVar260._12_4_ < 0.0 || ABS(auVar260._12_4_) < 1e-18);
      auVar148._0_8_ = CONCAT44(uVar61,uVar58) & 0xff800000ff800000;
      auVar148._8_4_ = uVar59 & 0xff800000;
      auVar148._12_4_ = uVar62 & 0xff800000;
      auVar117._0_4_ = ~uVar58 & (uint)fVar251;
      auVar117._4_4_ = ~uVar61 & (uint)fVar275;
      auVar117._8_4_ = ~uVar59 & (uint)fVar294;
      auVar117._12_4_ = ~uVar62 & (uint)fVar308;
      auVar74 = maxps(auVar74,auVar117 | auVar148);
      uVar61 = -(uint)(0.0 < auVar260._0_4_ || ABS(auVar260._0_4_) < 1e-18);
      uVar59 = -(uint)(0.0 < auVar260._4_4_ || ABS(auVar260._4_4_) < 1e-18);
      uVar60 = -(uint)(0.0 < auVar260._8_4_ || ABS(auVar260._8_4_) < 1e-18);
      uVar63 = -(uint)(0.0 < auVar260._12_4_ || ABS(auVar260._12_4_) < 1e-18);
      uVar322 = DAT_01f45a30._4_4_;
      uVar328 = DAT_01f45a30._12_4_;
      uVar58 = (uint)DAT_01f45a30;
      auVar118._0_4_ = uVar58 & uVar61;
      auVar118._4_4_ = uVar322 & uVar59;
      uVar62 = DAT_01f45a30._8_4_;
      auVar118._8_4_ = uVar62 & uVar60;
      auVar118._12_4_ = uVar328 & uVar63;
      auVar261._0_4_ = ~uVar61 & (uint)fVar251;
      auVar261._4_4_ = ~uVar59 & (uint)fVar275;
      auVar261._8_4_ = ~uVar60 & (uint)fVar294;
      auVar261._12_4_ = ~uVar63 & (uint)fVar308;
      auVar244 = minps(auVar244,auVar261 | auVar118);
      auVar149._0_4_ = (0.0 - fVar334) * -fVar281 + (0.0 - fVar306) * -fVar208;
      auVar149._4_4_ = (0.0 - fVar335) * -fVar284 + (0.0 - fVar309) * -fVar228;
      auVar149._8_4_ = (0.0 - fVar337) * -fVar292 + (0.0 - fVar312) * -fVar232;
      auVar149._12_4_ = 0x80000000;
      auVar135._0_4_ = -fVar272 * local_2e8 + -fVar281 * fVar141 + -fVar208 * fVar142;
      auVar135._4_4_ = -fVar276 * fStack_2e4 + -fVar284 * fVar141 + -fVar228 * fVar142;
      auVar135._8_4_ = -fVar270 * fStack_2e0 + -fVar292 * fVar141 + -fVar232 * fVar142;
      auVar135._12_4_ = fStack_2dc * -0.0 + fVar141 * -0.0 + fVar142 * -0.0;
      auVar259 = rcpps(auVar149,auVar135);
      fVar251 = auVar259._0_4_;
      fVar275 = auVar259._4_4_;
      fVar294 = auVar259._8_4_;
      fVar308 = auVar259._12_4_;
      fVar251 = (((float)DAT_01f46a60 - auVar135._0_4_ * fVar251) * fVar251 + fVar251) *
                -((0.0 - fVar320) * -fVar272 + auVar149._0_4_);
      fVar275 = ((DAT_01f46a60._4_4_ - auVar135._4_4_ * fVar275) * fVar275 + fVar275) *
                -((0.0 - fVar324) * -fVar276 + auVar149._4_4_);
      fVar294 = ((DAT_01f46a60._8_4_ - auVar135._8_4_ * fVar294) * fVar294 + fVar294) *
                -((0.0 - fVar326) * -fVar270 + auVar149._8_4_);
      fVar308 = ((DAT_01f46a60._12_4_ - auVar135._12_4_ * fVar308) * fVar308 + fVar308) * 0.0;
      uVar61 = -(uint)(auVar135._0_4_ < 0.0 || ABS(auVar135._0_4_) < 1e-18);
      uVar59 = -(uint)(auVar135._4_4_ < 0.0 || ABS(auVar135._4_4_) < 1e-18);
      uVar60 = -(uint)(auVar135._8_4_ < 0.0 || ABS(auVar135._8_4_) < 1e-18);
      uVar63 = -(uint)(auVar135._12_4_ < 0.0 || ABS(auVar135._12_4_) < 1e-18);
      auVar150._0_8_ = CONCAT44(uVar59,uVar61) & 0xff800000ff800000;
      auVar150._8_4_ = uVar60 & 0xff800000;
      auVar150._12_4_ = uVar63 & 0xff800000;
      auVar119._0_4_ = ~uVar61 & (uint)fVar251;
      auVar119._4_4_ = ~uVar59 & (uint)fVar275;
      auVar119._8_4_ = ~uVar60 & (uint)fVar294;
      auVar119._12_4_ = ~uVar63 & (uint)fVar308;
      local_4d8 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar74,auVar119 | auVar150);
      uVar61 = -(uint)(0.0 < auVar135._0_4_ || ABS(auVar135._0_4_) < 1e-18);
      uVar59 = -(uint)(0.0 < auVar135._4_4_ || ABS(auVar135._4_4_) < 1e-18);
      uVar60 = -(uint)(0.0 < auVar135._8_4_ || ABS(auVar135._8_4_) < 1e-18);
      uVar63 = -(uint)(0.0 < auVar135._12_4_ || ABS(auVar135._12_4_) < 1e-18);
      auVar120._0_4_ = uVar58 & uVar61;
      auVar120._4_4_ = uVar322 & uVar59;
      auVar120._8_4_ = uVar62 & uVar60;
      auVar120._12_4_ = uVar328 & uVar63;
      auVar136._0_4_ = ~uVar61 & (uint)fVar251;
      auVar136._4_4_ = ~uVar59 & (uint)fVar275;
      auVar136._8_4_ = ~uVar60 & (uint)fVar294;
      auVar136._12_4_ = ~uVar63 & (uint)fVar308;
      tp1.upper.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)minps(auVar244,auVar136 | auVar120);
      fVar251 = local_4d8.v[3];
      fVar275 = local_4d8.v[0];
      fVar294 = local_4d8.v[1];
      fVar308 = local_4d8.v[2];
      auVar333._0_4_ = -(uint)(fVar275 <= tp1.upper.field_0._0_4_) & auVar201._0_4_;
      auVar333._4_4_ = -(uint)(fVar294 <= tp1.upper.field_0._4_4_) & auVar201._4_4_;
      auVar333._8_4_ = -(uint)(fVar308 <= tp1.upper.field_0._8_4_) & auVar201._8_4_;
      auVar333._12_4_ = -(uint)(fVar251 <= tp1.upper.field_0._12_4_) & auVar201._12_4_;
      iVar43 = movmskps(iVar43,auVar333);
      pRVar47 = (RTCRayN *)CONCAT44(uVar45,iVar43);
      if (iVar43 != 0) {
        auVar259 = maxps(ZEXT816(0),_local_4f8);
        auVar74 = minps(auVar217,_DAT_01f46a60);
        auVar168._0_12_ = ZEXT812(0);
        auVar168._12_4_ = 0.0;
        auVar244 = maxps(auVar74,auVar168);
        auVar26._4_4_ = fStack_204;
        auVar26._0_4_ = local_208;
        auVar26._8_4_ = fStack_200;
        auVar26._12_4_ = fStack_1fc;
        auVar74 = minps(auVar26,_DAT_01f46a60);
        auVar74 = maxps(auVar74,auVar168);
        local_108._0_4_ = (auVar244._0_4_ + 0.0) * 0.25 * fVar323 + fVar144;
        local_108._4_4_ = (auVar244._4_4_ + 1.0) * 0.25 * fVar323 + fVar144;
        local_108._8_4_ = (auVar244._8_4_ + 2.0) * 0.25 * fVar323 + fVar144;
        local_108._12_4_ = (auVar244._12_4_ + 3.0) * 0.25 * fVar323 + fVar144;
        local_118[0] = (auVar74._0_4_ + 0.0) * 0.25 * fVar323 + fVar144;
        local_118[1] = (auVar74._4_4_ + 1.0) * 0.25 * fVar323 + fVar144;
        local_118[2] = (auVar74._8_4_ + 2.0) * 0.25 * fVar323 + fVar144;
        local_118[3] = (auVar74._12_4_ + 3.0) * 0.25 * fVar323 + fVar144;
        fVar266 = fVar266 - auVar259._0_4_ * auVar259._0_4_;
        fVar283 = fVar283 - auVar259._4_4_ * auVar259._4_4_;
        fVar298 = fVar298 - auVar259._8_4_ * auVar259._8_4_;
        fVar314 = fVar314 - auVar259._12_4_ * auVar259._12_4_;
        auVar137._0_4_ = fVar256 * 4.0 * fVar266;
        auVar137._4_4_ = fVar278 * 4.0 * fVar283;
        auVar137._8_4_ = fVar296 * 4.0 * fVar298;
        auVar137._12_4_ = fVar311 * 4.0 * fVar314;
        auVar121._0_4_ = fVar267 * fVar267 - auVar137._0_4_;
        auVar121._4_4_ = fVar235 * fVar235 - auVar137._4_4_;
        auVar121._8_4_ = fVar265 * fVar265 - auVar137._8_4_;
        auVar121._12_4_ = fVar273 * fVar273 - auVar137._12_4_;
        auVar290._4_4_ = -(uint)(0.0 <= auVar121._4_4_);
        auVar290._0_4_ = -(uint)(0.0 <= auVar121._0_4_);
        auVar290._8_4_ = -(uint)(0.0 <= auVar121._8_4_);
        auVar290._12_4_ = -(uint)(0.0 <= auVar121._12_4_);
        iVar43 = movmskps(iVar43,auVar290);
        if (iVar43 == 0) {
          _local_5a8 = ZEXT816(0);
          fVar271 = 0.0;
          fVar291 = 0.0;
          fVar305 = 0.0;
          fVar319 = 0.0;
          fVar323 = 0.0;
          fVar175 = 0.0;
          fVar177 = 0.0;
          fVar208 = 0.0;
          fVar256 = 0.0;
          fVar278 = 0.0;
          fVar296 = 0.0;
          fVar311 = 0.0;
          _local_4f8 = ZEXT816(0);
          iVar43 = 0;
          auVar230 = _DAT_01f45a40;
          auVar248 = _DAT_01f45a30;
        }
        else {
          auVar259 = sqrtps(local_108,auVar121);
          auVar91._0_4_ = fVar256 + fVar256;
          auVar91._4_4_ = fVar278 + fVar278;
          auVar91._8_4_ = fVar296 + fVar296;
          auVar91._12_4_ = fVar311 + fVar311;
          auVar74 = rcpps(auVar137,auVar91);
          fVar210 = auVar74._0_4_;
          fVar228 = auVar74._4_4_;
          fVar211 = auVar74._8_4_;
          fVar232 = auVar74._12_4_;
          fVar210 = ((float)DAT_01f46a60 - auVar91._0_4_ * fVar210) * fVar210 + fVar210;
          fVar228 = (DAT_01f46a60._4_4_ - auVar91._4_4_ * fVar228) * fVar228 + fVar228;
          fVar211 = (DAT_01f46a60._8_4_ - auVar91._8_4_ * fVar211) * fVar211 + fVar211;
          fVar232 = (DAT_01f46a60._12_4_ - auVar91._12_4_ * fVar232) * fVar232 + fVar232;
          fVar269 = (-fVar267 - auVar259._0_4_) * fVar210;
          fVar272 = (-fVar235 - auVar259._4_4_) * fVar228;
          fVar276 = (-fVar265 - auVar259._8_4_) * fVar211;
          fVar270 = (-fVar273 - auVar259._12_4_) * fVar232;
          fVar210 = (auVar259._0_4_ - fVar267) * fVar210;
          fVar228 = (auVar259._4_4_ - fVar235) * fVar228;
          fVar211 = (auVar259._8_4_ - fVar265) * fVar211;
          fVar232 = (auVar259._12_4_ - fVar273) * fVar232;
          fVar213 = (fVar339 * fVar269 + fVar316) * fVar271;
          fVar267 = (fVar340 * fVar272 + fVar321) * fVar291;
          fVar235 = (fVar341 * fVar276 + fVar325) * fVar305;
          fVar265 = (fVar342 * fVar270 + fVar327) * fVar319;
          fVar323 = local_2e8 * fVar269 - (local_338 * fVar213 + fVar315);
          fVar175 = fStack_2e4 * fVar272 - (fStack_334 * fVar267 + fVar320);
          fVar177 = fStack_2e0 * fVar276 - (fStack_330 * fVar235 + fVar324);
          fVar208 = fStack_2dc * fVar270 - (fStack_32c * fVar265 + fVar326);
          fVar256 = fVar141 * fVar269 - ((float)local_328._0_4_ * fVar213 + fVar329);
          fVar278 = fVar141 * fVar272 - ((float)local_328._4_4_ * fVar267 + fVar334);
          fVar296 = fVar141 * fVar276 - (fStack_320 * fVar235 + fVar335);
          fVar311 = fVar141 * fVar270 - (fStack_31c * fVar265 + fVar337);
          local_4f8._4_4_ = fVar142 * fVar272 - (fVar267 * fVar225 + fVar306);
          local_4f8._0_4_ = fVar142 * fVar269 - (fVar213 * fVar223 + fVar299);
          fStack_4f0 = fVar142 * fVar276 - (fVar235 * fVar226 + fVar309);
          fStack_4ec = fVar142 * fVar270 - (fVar265 * fVar264 + fVar312);
          fVar271 = (fVar339 * fVar210 + fVar316) * fVar271;
          fVar291 = (fVar340 * fVar228 + fVar321) * fVar291;
          fVar305 = (fVar341 * fVar211 + fVar325) * fVar305;
          fVar319 = (fVar342 * fVar232 + fVar327) * fVar319;
          local_5a8._4_4_ = fStack_2e4 * fVar228 - (fStack_334 * fVar291 + fVar320);
          local_5a8._0_4_ = local_2e8 * fVar210 - (local_338 * fVar271 + fVar315);
          fStack_5a0 = fStack_2e0 * fVar211 - (fStack_330 * fVar305 + fVar324);
          fStack_59c = fStack_2dc * fVar232 - (fStack_32c * fVar319 + fVar326);
          auVar168._0_4_ = fVar141 * fVar210 - ((float)local_328._0_4_ * fVar271 + fVar329);
          auVar168._4_4_ = fVar141 * fVar228 - ((float)local_328._4_4_ * fVar291 + fVar334);
          auVar168._8_4_ = fVar141 * fVar211 - (fStack_320 * fVar305 + fVar335);
          auVar168._12_4_ = fVar141 * fVar232 - (fStack_31c * fVar319 + fVar337);
          bVar55 = 0.0 <= auVar121._0_4_;
          uVar61 = -(uint)bVar55;
          bVar11 = 0.0 <= auVar121._4_4_;
          uVar59 = -(uint)bVar11;
          bVar12 = 0.0 <= auVar121._8_4_;
          uVar60 = -(uint)bVar12;
          bVar13 = 0.0 <= auVar121._12_4_;
          uVar63 = -(uint)bVar13;
          fVar271 = fVar142 * fVar210 - (fVar271 * fVar223 + fVar299);
          fVar291 = fVar142 * fVar228 - (fVar291 * fVar225 + fVar306);
          fVar305 = fVar142 * fVar211 - (fVar305 * fVar226 + fVar309);
          fVar319 = fVar142 * fVar232 - (fVar319 * fVar264 + fVar312);
          auVar304._0_4_ = (uint)fVar269 & uVar61;
          auVar304._4_4_ = (uint)fVar272 & uVar59;
          auVar304._8_4_ = (uint)fVar276 & uVar60;
          auVar304._12_4_ = (uint)fVar270 & uVar63;
          auVar248._0_8_ = CONCAT44(~uVar59,~uVar61) & 0x7f8000007f800000;
          auVar248._8_4_ = ~uVar60 & 0x7f800000;
          auVar248._12_4_ = ~uVar63 & 0x7f800000;
          auVar248 = auVar248 | auVar304;
          auVar219._0_4_ = (uint)fVar210 & uVar61;
          auVar219._4_4_ = (uint)fVar228 & uVar59;
          auVar219._8_4_ = (uint)fVar211 & uVar60;
          auVar219._12_4_ = (uint)fVar232 & uVar63;
          auVar230._0_8_ = CONCAT44(~uVar59,~uVar61) & 0xff800000ff800000;
          auVar230._8_4_ = ~uVar60 & 0xff800000;
          auVar230._12_4_ = ~uVar63 & 0xff800000;
          auVar230 = auVar230 | auVar219;
          auVar24._4_4_ = fStack_2f4;
          auVar24._0_4_ = local_2f8;
          auVar24._8_4_ = fStack_2f0;
          auVar24._12_4_ = fStack_2ec;
          auVar74 = maxps(auVar24,auVar289);
          fVar210 = auVar74._0_4_ * 1.9073486e-06;
          fVar228 = auVar74._4_4_ * 1.9073486e-06;
          fVar211 = auVar74._8_4_ * 1.9073486e-06;
          fVar232 = auVar74._12_4_ * 1.9073486e-06;
          auVar220._0_4_ = -(uint)(fVar234 < fVar210 && bVar55);
          auVar220._4_4_ = -(uint)(fVar257 < fVar228 && bVar11);
          auVar220._8_4_ = -(uint)(fVar268 < fVar211 && bVar12);
          auVar220._12_4_ = -(uint)(fVar277 < fVar232 && bVar13);
          iVar43 = movmskps(iVar43,auVar220);
          if (iVar43 != 0) {
            uVar61 = -(uint)(fVar266 <= 0.0);
            uVar59 = -(uint)(fVar283 <= 0.0);
            uVar60 = -(uint)(fVar298 <= 0.0);
            uVar63 = -(uint)(fVar314 <= 0.0);
            auVar262._0_4_ = (uVar61 & (uint)DAT_01f45a40 | ~uVar61 & uVar58) & auVar220._0_4_;
            auVar262._4_4_ = (uVar59 & DAT_01f45a40._4_4_ | ~uVar59 & uVar322) & auVar220._4_4_;
            auVar262._8_4_ = (uVar60 & DAT_01f45a40._8_4_ | ~uVar60 & uVar62) & auVar220._8_4_;
            auVar262._12_4_ = (uVar63 & DAT_01f45a40._12_4_ | ~uVar63 & uVar328) & auVar220._12_4_;
            auVar274._0_4_ = ~auVar220._0_4_ & auVar248._0_4_;
            auVar274._4_4_ = ~auVar220._4_4_ & auVar248._4_4_;
            auVar274._8_4_ = ~auVar220._8_4_ & auVar248._8_4_;
            auVar274._12_4_ = ~auVar220._12_4_ & auVar248._12_4_;
            auVar250._0_4_ = (uVar61 & uVar58 | ~uVar61 & (uint)DAT_01f45a40) & auVar220._0_4_;
            auVar250._4_4_ = (uVar59 & uVar322 | ~uVar59 & DAT_01f45a40._4_4_) & auVar220._4_4_;
            auVar250._8_4_ = (uVar60 & uVar62 | ~uVar60 & DAT_01f45a40._8_4_) & auVar220._8_4_;
            auVar250._12_4_ = (uVar63 & uVar328 | ~uVar63 & DAT_01f45a40._12_4_) & auVar220._12_4_;
            auVar221._0_4_ = ~auVar220._0_4_ & auVar230._0_4_;
            auVar221._4_4_ = ~auVar220._4_4_ & auVar230._4_4_;
            auVar221._8_4_ = ~auVar220._8_4_ & auVar230._8_4_;
            auVar221._12_4_ = ~auVar220._12_4_ & auVar230._12_4_;
            auVar290._4_4_ = -(uint)((fVar228 <= fVar257 || fVar283 <= 0.0) && bVar11);
            auVar290._0_4_ = -(uint)((fVar210 <= fVar234 || fVar266 <= 0.0) && bVar55);
            auVar290._8_4_ = -(uint)((fVar211 <= fVar268 || fVar298 <= 0.0) && bVar12);
            auVar290._12_4_ = -(uint)((fVar232 <= fVar277 || fVar314 <= 0.0) && bVar13);
            auVar230 = auVar221 | auVar250;
            auVar248 = auVar274 | auVar262;
          }
        }
        fVar266 = (ray->super_RayK<1>).dir.field_0.m128[0];
        fVar283 = (ray->super_RayK<1>).dir.field_0.m128[1];
        fVar298 = (ray->super_RayK<1>).dir.field_0.m128[2];
        auVar74 = minps((undefined1  [16])tp1.upper.field_0,auVar248);
        aVar249 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                  maxps((undefined1  [16])local_4d8,auVar230);
        tp1.lower.field_0 = aVar249;
        local_328._0_4_ = -(uint)(fVar275 <= auVar74._0_4_) & auVar333._0_4_;
        local_328._4_4_ = -(uint)(fVar294 <= auVar74._4_4_) & auVar333._4_4_;
        fStack_320 = (float)(-(uint)(fVar308 <= auVar74._8_4_) & auVar333._8_4_);
        fStack_31c = (float)(-(uint)(fVar251 <= auVar74._12_4_) & auVar333._12_4_);
        uVar58 = -(uint)(aVar249.v[0] <= tp1.upper.field_0._0_4_) & auVar333._0_4_;
        uVar61 = -(uint)(aVar249.v[1] <= tp1.upper.field_0._4_4_) & auVar333._4_4_;
        auVar92._4_4_ = uVar61;
        auVar92._0_4_ = uVar58;
        uVar59 = -(uint)(aVar249.v[2] <= tp1.upper.field_0._8_4_) & auVar333._8_4_;
        uVar62 = -(uint)(aVar249.v[3] <= tp1.upper.field_0._12_4_) & auVar333._12_4_;
        auVar92._8_4_ = uVar59;
        auVar92._12_4_ = uVar62;
        iVar43 = movmskps(iVar43,auVar92 | _local_328);
        pRVar47 = (RTCRayN *)CONCAT44(uVar45,iVar43);
        if (iVar43 != 0) {
          local_338 = (float)local_60c;
          fStack_334 = (float)local_60c;
          fStack_330 = (float)local_60c;
          fStack_32c = (float)local_60c;
          local_4f8._0_4_ =
               -(uint)((int)local_60c <
                      ((int)((-(uint)(0.3 <= ABS((float)local_4f8._0_4_ * fVar298 +
                                                 fVar256 * fVar283 + fVar323 * fVar266)) &
                             auVar290._0_4_) << 0x1f) >> 0x1f) + 4);
          local_4f8._4_4_ =
               -(uint)((int)local_60c <
                      ((int)((-(uint)(0.3 <= ABS((float)local_4f8._4_4_ * fVar298 +
                                                 fVar278 * fVar283 + fVar175 * fVar266)) &
                             auVar290._4_4_) << 0x1f) >> 0x1f) + 4);
          fStack_4f0 = (float)-(uint)((int)local_60c <
                                     ((int)((-(uint)(0.3 <= ABS(fStack_4f0 * fVar298 +
                                                                fVar296 * fVar283 +
                                                                fVar177 * fVar266)) & auVar290._8_4_
                                            ) << 0x1f) >> 0x1f) + 4);
          fStack_4ec = (float)-(uint)((int)local_60c <
                                     ((int)((-(uint)(0.3 <= ABS(fStack_4ec * fVar298 +
                                                                fVar311 * fVar283 +
                                                                fVar208 * fVar266)) &
                                            auVar290._12_4_) << 0x1f) >> 0x1f) + 4);
          auVar93 = ~_local_4f8 & _local_328;
          fVar256 = local_4e8 + fVar275;
          fVar278 = fStack_4e4 + fVar294;
          fVar296 = fStack_4e0 + fVar308;
          fVar311 = fStack_4dc + fVar251;
          while( true ) {
            local_2c8 = auVar93;
            uVar45 = (undefined4)((ulong)pRVar47 >> 0x20);
            iVar43 = movmskps((int)pRVar47,auVar93);
            pRVar47 = (RTCRayN *)CONCAT44(uVar45,iVar43);
            if (iVar43 == 0) break;
            uVar60 = auVar93._0_4_;
            uVar63 = auVar93._4_4_;
            uVar322 = auVar93._8_4_;
            uVar328 = auVar93._12_4_;
            auVar122._0_4_ = uVar60 & local_4d8.i[0];
            auVar122._4_4_ = uVar63 & local_4d8.i[1];
            auVar122._8_4_ = uVar322 & local_4d8.i[2];
            auVar122._12_4_ = uVar328 & local_4d8.i[3];
            auVar138._0_8_ = CONCAT44(~uVar63,~uVar60) & 0x7f8000007f800000;
            auVar138._8_4_ = ~uVar322 & 0x7f800000;
            auVar138._12_4_ = ~uVar328 & 0x7f800000;
            auVar138 = auVar138 | auVar122;
            auVar151._4_4_ = auVar138._0_4_;
            auVar151._0_4_ = auVar138._4_4_;
            auVar151._8_4_ = auVar138._12_4_;
            auVar151._12_4_ = auVar138._8_4_;
            auVar74 = minps(auVar151,auVar138);
            auVar123._0_8_ = auVar74._8_8_;
            auVar123._8_4_ = auVar74._0_4_;
            auVar123._12_4_ = auVar74._4_4_;
            auVar74 = minps(auVar123,auVar74);
            auVar124._0_8_ =
                 CONCAT44(-(uint)(auVar74._4_4_ == auVar138._4_4_) & uVar63,
                          -(uint)(auVar74._0_4_ == auVar138._0_4_) & uVar60);
            auVar124._8_4_ = -(uint)(auVar74._8_4_ == auVar138._8_4_) & uVar322;
            auVar124._12_4_ = -(uint)(auVar74._12_4_ == auVar138._12_4_) & uVar328;
            iVar43 = movmskps(iVar43,auVar124);
            if (iVar43 != 0) {
              auVar93._8_4_ = auVar124._8_4_;
              auVar93._0_8_ = auVar124._0_8_;
              auVar93._12_4_ = auVar124._12_4_;
            }
            uVar44 = movmskps(iVar43,auVar93);
            uVar52 = CONCAT44(uVar45,uVar44);
            pRVar47 = (RTCRayN *)0x0;
            if (uVar52 != 0) {
              for (; (uVar52 >> (long)pRVar47 & 1) == 0; pRVar47 = pRVar47 + 1) {
              }
            }
            *(undefined4 *)(local_2c8 + (long)pRVar47 * 4) = 0;
            fVar314 = (ray->super_RayK<1>).dir.field_0.m128[0];
            fVar323 = (ray->super_RayK<1>).dir.field_0.m128[1];
            fVar175 = (ray->super_RayK<1>).dir.field_0.m128[2];
            fVar177 = (ray->super_RayK<1>).dir.field_0.m128[3];
            auVar15._4_4_ = fStack_4b4;
            auVar15._0_4_ = local_4b8;
            auVar15._8_4_ = fStack_4b0;
            auVar15._12_4_ = fStack_4ac;
            auVar21._4_4_ = fVar227;
            auVar21._0_4_ = fVar212;
            auVar21._8_4_ = fVar231;
            auVar21._12_4_ = fVar233;
            auVar259 = minps(auVar15,auVar21);
            auVar244 = maxps(auVar15,auVar21);
            auVar19._4_4_ = fVar176;
            auVar19._0_4_ = fVar143;
            auVar19._8_4_ = fVar207;
            auVar19._12_4_ = fVar209;
            auVar17._4_4_ = fVar131;
            auVar17._0_4_ = fVar132;
            auVar17._8_4_ = fVar133;
            auVar17._12_4_ = fVar222;
            auVar74 = minps(auVar19,auVar17);
            auVar259 = minps(auVar259,auVar74);
            auVar74 = maxps(auVar19,auVar17);
            auVar244 = maxps(auVar244,auVar74);
            auVar152._0_8_ = auVar259._0_8_ & 0x7fffffff7fffffff;
            auVar152._8_4_ = auVar259._8_4_ & 0x7fffffff;
            auVar152._12_4_ = auVar259._12_4_ & 0x7fffffff;
            auVar94._0_8_ = auVar244._0_8_ & 0x7fffffff7fffffff;
            auVar94._8_4_ = auVar244._8_4_ & 0x7fffffff;
            auVar94._12_4_ = ABS(auVar244._12_4_);
            auVar74 = maxps(auVar152,auVar94);
            fVar208 = auVar74._4_4_;
            if (auVar74._4_4_ <= auVar74._0_4_) {
              fVar208 = auVar74._0_4_;
            }
            auVar153._8_8_ = auVar74._8_8_;
            auVar153._0_8_ = auVar74._8_8_;
            if (auVar74._8_4_ <= fVar208) {
              auVar153._0_4_ = fVar208;
            }
            fVar228 = auVar153._0_4_ * 1.9073486e-06;
            fVar208 = *(float *)(local_108 + (long)pRVar47 * 4);
            fVar210 = local_118[(long)(pRVar47 + -8)];
            lVar54 = 5;
            do {
              bVar55 = lVar54 == 0;
              lVar54 = lVar54 + -1;
              if (bVar55) goto LAB_0031575e;
              fVar225 = SQRT(fVar175 * fVar175 + fVar323 * fVar323 + fVar314 * fVar314) *
                        1.9073486e-06 * fVar210;
              fVar211 = 1.0 - fVar208;
              fVar264 = fVar212 * fVar211 + fVar143 * fVar208;
              fVar267 = fVar227 * fVar211 + fVar176 * fVar208;
              fVar234 = fVar231 * fVar211 + fVar207 * fVar208;
              fVar235 = fVar233 * fVar211 + fVar209 * fVar208;
              fVar232 = (local_4b8 * fVar211 + fVar212 * fVar208) * fVar211 + fVar208 * fVar264;
              fVar213 = (fStack_4b4 * fVar211 + fVar227 * fVar208) * fVar211 + fVar208 * fVar267;
              fVar223 = (fStack_4b0 * fVar211 + fVar231 * fVar208) * fVar211 + fVar208 * fVar234;
              fVar226 = (fStack_4ac * fVar211 + fVar233 * fVar208) * fVar211 + fVar208 * fVar235;
              fVar264 = fVar264 * fVar211 + (fVar143 * fVar211 + fVar132 * fVar208) * fVar208;
              fVar267 = fVar267 * fVar211 + (fVar176 * fVar211 + fVar131 * fVar208) * fVar208;
              fVar257 = fVar234 * fVar211 + (fVar207 * fVar211 + fVar133 * fVar208) * fVar208;
              fVar265 = fVar235 * fVar211 + (fVar209 * fVar211 + fVar222 * fVar208) * fVar208;
              local_4c8 = fVar211 * fVar232 + fVar208 * fVar264;
              fStack_4c4 = fVar211 * fVar213 + fVar208 * fVar267;
              fStack_4c0 = fVar211 * fVar223 + fVar208 * fVar257;
              fStack_4bc = fVar211 * fVar226 + fVar208 * fVar265;
              fVar234 = (fVar264 - fVar232) * 3.0;
              fVar235 = (fVar267 - fVar213) * 3.0;
              fVar257 = (fVar257 - fVar223) * 3.0;
              fVar265 = (fVar265 - fVar226) * 3.0;
              fVar232 = fVar211 * 6.0;
              fVar226 = (fVar208 - (fVar211 + fVar211)) * 6.0;
              fVar264 = (fVar211 - (fVar208 + fVar208)) * 6.0;
              fVar211 = fVar208 * 6.0;
              fVar213 = fVar232 * local_4b8 +
                        fVar226 * fVar212 + fVar264 * fVar143 + fVar211 * fVar132;
              fVar223 = fVar232 * fStack_4b4 +
                        fVar226 * fVar227 + fVar264 * fVar176 + fVar211 * fVar131;
              fVar232 = fVar232 * fStack_4b0 +
                        fVar226 * fVar231 + fVar264 * fVar207 + fVar211 * fVar133;
              fVar226 = (fVar210 * fVar314 + 0.0) - local_4c8;
              fVar264 = (fVar210 * fVar323 + 0.0) - fStack_4c4;
              fVar267 = (fVar210 * fVar175 + 0.0) - fStack_4c0;
              fVar268 = (fVar210 * fVar177 + 0.0) - fStack_4bc;
              fVar211 = fVar264 * fVar264;
              fStack_3a0 = fVar267 * fVar267;
              fStack_39c = fVar268 * fVar268;
              local_3a8._0_4_ = fVar211 + fVar226 * fVar226 + fStack_3a0;
              local_3a8._4_4_ = fVar211 + fVar211 + fStack_39c;
              fStack_3a0 = fVar211 + fStack_3a0 + fStack_3a0;
              fStack_39c = fVar211 + fStack_39c + fStack_39c;
              fVar211 = fVar228;
              if (fVar228 <= fVar225) {
                fVar211 = fVar225;
              }
              fVar269 = fVar235 * fVar235 + fVar234 * fVar234 + fVar257 * fVar257;
              auVar259 = ZEXT416((uint)fVar269);
              auVar74 = rsqrtss(ZEXT416((uint)fVar269),auVar259);
              fVar225 = auVar74._0_4_;
              fVar272 = fVar225 * 1.5 - fVar225 * fVar225 * fVar269 * 0.5 * fVar225;
              fVar277 = fVar234 * fVar272;
              fVar279 = fVar235 * fVar272;
              fVar280 = fVar257 * fVar272;
              fVar281 = fVar265 * fVar272;
              fVar282 = fVar257 * fVar232 + fVar235 * fVar223 + fVar234 * fVar213;
              auVar74 = rcpss(auVar259,auVar259);
              fVar225 = (2.0 - fVar269 * auVar74._0_4_) * auVar74._0_4_;
              fVar276 = fVar264 * fVar279;
              fVar270 = fVar267 * fVar280;
              fVar273 = fVar268 * fVar281;
              fVar285 = fVar276 + fVar226 * fVar277 + fVar270;
              fVar292 = fVar276 + fVar276 + fVar273;
              fVar270 = fVar276 + fVar270 + fVar270;
              fVar273 = fVar276 + fVar273 + fVar273;
              fVar284 = (SQRT((float)local_3a8._0_4_) + 1.0) * (fVar228 / SQRT(fVar269)) +
                        SQRT((float)local_3a8._0_4_) * fVar228 + fVar211;
              fVar276 = fVar281 * -fVar265;
              fVar223 = fVar280 * -fVar257 + fVar279 * -fVar235 + fVar277 * -fVar234 +
                        fVar225 * (fVar269 * fVar232 - fVar282 * fVar257) * fVar272 * fVar267 +
                        fVar225 * (fVar269 * fVar223 - fVar282 * fVar235) * fVar272 * fVar264 +
                        fVar225 * (fVar269 * fVar213 - fVar282 * fVar234) * fVar272 * fVar226;
              fVar225 = fVar175 * fVar280 + fVar323 * fVar279 + fVar314 * fVar277;
              fVar232 = (float)local_3a8._0_4_ - fVar285 * fVar285;
              auVar95._0_8_ = CONCAT44((float)local_3a8._4_4_ - fVar292 * fVar292,fVar232);
              auVar95._8_4_ = fStack_3a0 - fVar270 * fVar270;
              auVar95._12_4_ = fStack_39c - fVar273 * fVar273;
              local_5c8 = CONCAT44(fVar276,fVar223);
              auVar125._8_4_ = auVar95._8_4_;
              auVar125._0_8_ = auVar95._0_8_;
              auVar125._12_4_ = auVar95._12_4_;
              auVar74 = rsqrtss(auVar125,auVar95);
              fVar213 = auVar74._0_4_;
              fVar213 = fVar213 * 1.5 - fVar213 * fVar213 * fVar232 * 0.5 * fVar213;
              if (fVar232 < 0.0) {
                fVar232 = sqrtf(fVar232);
                pRVar47 = extraout_RAX;
                p_Var50 = extraout_RDX;
              }
              else {
                fVar232 = SQRT(fVar232);
              }
              fVar232 = fVar232 - fStack_4bc;
              fVar269 = ((-fVar257 * fVar267 + -fVar235 * fVar264 + -fVar234 * fVar226) -
                        fVar285 * fVar223) * fVar213 - fVar265;
              fVar213 = ((fVar175 * fVar267 + fVar323 * fVar264 + fVar314 * fVar226) -
                        fVar285 * fVar225) * fVar213;
              auVar169._0_4_ = (uint)fVar269 ^ (uint)DAT_01f46720;
              auVar170._4_4_ = (uint)(-fVar265 * fVar268) ^ DAT_01f46720._4_4_;
              auVar170._0_4_ = auVar169._0_4_;
              auVar154._0_4_ = fVar223 * fVar213 - fVar225 * fVar269;
              auVar170._8_4_ = auVar170._4_4_;
              auVar170._12_4_ = fVar177 * fVar268;
              auVar169._8_8_ = auVar170._8_8_;
              auVar169._4_4_ = fVar213;
              auVar154._4_4_ = auVar154._0_4_;
              auVar154._8_4_ = auVar154._0_4_;
              auVar154._12_4_ = auVar154._0_4_;
              auVar74 = divps(auVar169,auVar154);
              auVar203._8_4_ = fVar276;
              auVar203._0_8_ = local_5c8;
              auVar203._12_4_ = (uint)(fVar177 * fVar281) ^ DAT_01f46720._4_4_;
              auVar202._8_8_ = auVar203._8_8_;
              auVar202._4_4_ = (uint)fVar225 ^ (uint)DAT_01f46720;
              auVar202._0_4_ = fVar223;
              auVar259 = divps(auVar202,auVar154);
              fVar210 = fVar210 - (fVar232 * auVar259._0_4_ + fVar285 * auVar74._0_4_);
              fVar208 = fVar208 - (fVar232 * auVar259._4_4_ + fVar285 * auVar74._4_4_);
            } while ((fVar284 <= ABS(fVar285)) ||
                    (auVar244._12_4_ * 1.9073486e-06 + fVar211 + fVar284 <= ABS(fVar232)));
            fVar210 = local_318._0_4_ + fVar210;
            if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar210) &&
               (((fVar314 = (ray->super_RayK<1>).tfar, fVar210 <= fVar314 && (0.0 <= fVar208)) &&
                (fVar208 <= 1.0)))) {
              auVar74 = rsqrtss(_local_3a8,_local_3a8);
              fVar323 = auVar74._0_4_;
              pGVar9 = (context->scene->geometries).items[uVar56].ptr;
              uVar60 = (ray->super_RayK<1>).mask;
              pRVar47 = (RTCRayN *)(ulong)uVar60;
              if ((pGVar9->mask & uVar60) != 0) {
                fVar323 = fVar323 * 1.5 +
                          fVar323 * fVar323 * (float)local_3a8._0_4_ * -0.5 * fVar323;
                fVar226 = fVar226 * fVar323;
                fVar264 = fVar264 * fVar323;
                fVar267 = fVar267 * fVar323;
                fVar323 = fVar265 * fVar226 + fVar234;
                fVar175 = fVar265 * fVar264 + fVar235;
                fVar177 = fVar265 * fVar267 + fVar257;
                fVar211 = fVar264 * fVar234 - fVar235 * fVar226;
                fVar232 = fVar267 * fVar235 - fVar257 * fVar264;
                fVar213 = fVar226 * fVar257 - fVar234 * fVar267;
                fVar228 = fVar175 * fVar232 - fVar213 * fVar323;
                uVar108 = CONCAT44(fVar323 * fVar211 - fVar232 * fVar177,
                                   fVar177 * fVar213 - fVar211 * fVar175);
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  (ray->super_RayK<1>).tfar = fVar210;
                  *(undefined8 *)&(ray->Ng).field_0 = uVar108;
                  (ray->Ng).field_0.field_0.z = fVar228;
                  ray->u = fVar208;
                  ray->v = 0.0;
                  ray->primID = uVar57;
                  ray->geomID = uVar56;
                  ray->instID[0] = context->user->instID[0];
                  uVar60 = context->user->instPrimID[0];
                  ray->instPrimID[0] = uVar60;
                  pRVar47 = (RTCRayN *)(ulong)uVar60;
                }
                else {
                  vu0.field_0._0_8_ = uVar108;
                  vu0.field_0.v[2] = fVar228;
                  vu0.field_0.v[3] = fVar208;
                  (ray->super_RayK<1>).tfar = fVar210;
                  local_348._0_4_ = 0xffffffff;
                  args.geometryUserPtr = pGVar9->userPtr;
                  args.valid = (int *)local_348;
                  args.context = context->user;
                  args.hit = (RTCHitN *)&vu0;
                  args.N = 1;
                  args.ray = (RTCRayN *)ray;
                  if (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0031585c:
                    p_Var50 = context->args->filter;
                    if ((p_Var50 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var50)(&args);
                      p_Var50 = extraout_RDX_01;
                      if (*args.valid == 0) goto LAB_003158ea;
                    }
                    *(undefined4 *)(args.ray + 0x30) = *(undefined4 *)args.hit;
                    *(undefined4 *)(args.ray + 0x34) = *(undefined4 *)(args.hit + 4);
                    *(undefined4 *)(args.ray + 0x38) = *(undefined4 *)(args.hit + 8);
                    *(undefined4 *)(args.ray + 0x3c) = *(undefined4 *)(args.hit + 0xc);
                    *(undefined4 *)(args.ray + 0x40) = *(undefined4 *)(args.hit + 0x10);
                    *(undefined4 *)(args.ray + 0x44) = *(undefined4 *)(args.hit + 0x14);
                    *(undefined4 *)(args.ray + 0x48) = *(undefined4 *)(args.hit + 0x18);
                    p_Var50 = (RTCFilterFunctionN)(ulong)*(uint *)(args.hit + 0x1c);
                    *(uint *)(args.ray + 0x4c) = *(uint *)(args.hit + 0x1c);
                    *(undefined4 *)(args.ray + 0x50) = *(undefined4 *)(args.hit + 0x20);
                    pRVar47 = args.ray;
                  }
                  else {
                    (*pGVar9->intersectionFilterN)(&args);
                    p_Var50 = extraout_RDX_00;
                    if (*args.valid != 0) goto LAB_0031585c;
LAB_003158ea:
                    (ray->super_RayK<1>).tfar = fVar314;
                    pRVar47 = (RTCRayN *)args.valid;
                  }
                }
              }
            }
LAB_0031575e:
            fVar314 = (ray->super_RayK<1>).tfar;
            auVar93._0_4_ = -(uint)(fVar256 <= fVar314) & local_2c8._0_4_;
            auVar93._4_4_ = -(uint)(fVar278 <= fVar314) & local_2c8._4_4_;
            auVar93._8_4_ = -(uint)(fVar296 <= fVar314) & local_2c8._8_4_;
            auVar93._12_4_ = -(uint)(fVar311 <= fVar314) & local_2c8._12_4_;
          }
          fVar256 = (ray->super_RayK<1>).tfar;
          auVar155._0_4_ = -(uint)(aVar249.v[0] + local_4e8 <= fVar256) & uVar58;
          auVar155._4_4_ = -(uint)(aVar249.v[1] + fStack_4e4 <= fVar256) & uVar61;
          auVar155._8_4_ = -(uint)(aVar249.v[2] + fStack_4e0 <= fVar256) & uVar59;
          auVar155._12_4_ = -(uint)(aVar249.v[3] + fStack_4dc <= fVar256) & uVar62;
          auVar126._0_4_ =
               -(uint)((int)local_338 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_5a8._0_4_ * fVar266 +
                                                 auVar168._0_4_ * fVar283 + fVar271 * fVar298)) &
                             auVar290._0_4_) << 0x1f) >> 0x1f) + 4);
          auVar126._4_4_ =
               -(uint)((int)fStack_334 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_5a8._4_4_ * fVar266 +
                                                 auVar168._4_4_ * fVar283 + fVar291 * fVar298)) &
                             auVar290._4_4_) << 0x1f) >> 0x1f) + 4);
          auVar126._8_4_ =
               -(uint)((int)fStack_330 <
                      ((int)((-(uint)(0.3 <= ABS(fStack_5a0 * fVar266 +
                                                 auVar168._8_4_ * fVar283 + fVar305 * fVar298)) &
                             auVar290._8_4_) << 0x1f) >> 0x1f) + 4);
          auVar126._12_4_ =
               -(uint)((int)fStack_32c <
                      ((int)((-(uint)(0.3 <= ABS(fStack_59c * fVar266 +
                                                 auVar168._12_4_ * fVar283 + fVar319 * fVar298)) &
                             auVar290._12_4_) << 0x1f) >> 0x1f) + 4);
          auVar127 = ~auVar126 & auVar155;
          local_4d8 = tp1.lower.field_0;
          fVar266 = local_4e8 + tp1.lower.field_0.v[0];
          fVar271 = fStack_4e4 + tp1.lower.field_0.v[1];
          fVar278 = fStack_4e0 + tp1.lower.field_0.v[2];
          fVar283 = fStack_4dc + tp1.lower.field_0.v[3];
          while( true ) {
            local_348 = auVar127;
            iVar43 = movmskps((int)pRVar47,auVar127);
            if (iVar43 == 0) break;
            auVar259 = ~auVar127 & _DAT_01f45a30 | auVar127 & (undefined1  [16])local_4d8;
            auVar156._4_4_ = auVar259._0_4_;
            auVar156._0_4_ = auVar259._4_4_;
            auVar156._8_4_ = auVar259._12_4_;
            auVar156._12_4_ = auVar259._8_4_;
            auVar74 = minps(auVar156,auVar259);
            auVar96._0_8_ = auVar74._8_8_;
            auVar96._8_4_ = auVar74._0_4_;
            auVar96._12_4_ = auVar74._4_4_;
            auVar74 = minps(auVar96,auVar74);
            auVar97._0_8_ =
                 CONCAT44(-(uint)(auVar74._4_4_ == auVar259._4_4_) & auVar127._4_4_,
                          -(uint)(auVar74._0_4_ == auVar259._0_4_) & auVar127._0_4_);
            auVar97._8_4_ = -(uint)(auVar74._8_4_ == auVar259._8_4_) & auVar127._8_4_;
            auVar97._12_4_ = -(uint)(auVar74._12_4_ == auVar259._12_4_) & auVar127._12_4_;
            iVar43 = movmskps(iVar43,auVar97);
            if (iVar43 != 0) {
              auVar127._8_4_ = auVar97._8_4_;
              auVar127._0_8_ = auVar97._0_8_;
              auVar127._12_4_ = auVar97._12_4_;
            }
            uVar45 = movmskps(iVar43,auVar127);
            uVar52 = CONCAT44((int)((ulong)pRVar47 >> 0x20),uVar45);
            pRVar47 = (RTCRayN *)0x0;
            if (uVar52 != 0) {
              for (; (uVar52 >> (long)pRVar47 & 1) == 0; pRVar47 = pRVar47 + 1) {
              }
            }
            *(undefined4 *)(local_348 + (long)pRVar47 * 4) = 0;
            fVar256 = (ray->super_RayK<1>).dir.field_0.m128[0];
            fVar291 = (ray->super_RayK<1>).dir.field_0.m128[1];
            fVar296 = (ray->super_RayK<1>).dir.field_0.m128[2];
            fVar298 = (ray->super_RayK<1>).dir.field_0.m128[3];
            auVar16._4_4_ = fStack_4b4;
            auVar16._0_4_ = local_4b8;
            auVar16._8_4_ = fStack_4b0;
            auVar16._12_4_ = fStack_4ac;
            auVar22._4_4_ = fVar227;
            auVar22._0_4_ = fVar212;
            auVar22._8_4_ = fVar231;
            auVar22._12_4_ = fVar233;
            auVar259 = minps(auVar16,auVar22);
            auVar244 = maxps(auVar16,auVar22);
            auVar20._4_4_ = fVar176;
            auVar20._0_4_ = fVar143;
            auVar20._8_4_ = fVar207;
            auVar20._12_4_ = fVar209;
            auVar18._4_4_ = fVar131;
            auVar18._0_4_ = fVar132;
            auVar18._8_4_ = fVar133;
            auVar18._12_4_ = fVar222;
            auVar74 = minps(auVar20,auVar18);
            auVar259 = minps(auVar259,auVar74);
            auVar74 = maxps(auVar20,auVar18);
            auVar244 = maxps(auVar244,auVar74);
            auVar157._0_8_ = auVar259._0_8_ & 0x7fffffff7fffffff;
            auVar157._8_4_ = auVar259._8_4_ & 0x7fffffff;
            auVar157._12_4_ = auVar259._12_4_ & 0x7fffffff;
            auVar98._0_8_ = auVar244._0_8_ & 0x7fffffff7fffffff;
            auVar98._8_4_ = auVar244._8_4_ & 0x7fffffff;
            auVar98._12_4_ = ABS(auVar244._12_4_);
            auVar74 = maxps(auVar157,auVar98);
            fVar305 = auVar74._4_4_;
            if (auVar74._4_4_ <= auVar74._0_4_) {
              fVar305 = auVar74._0_4_;
            }
            auVar158._8_8_ = auVar74._8_8_;
            auVar158._0_8_ = auVar74._8_8_;
            if (auVar74._8_4_ <= fVar305) {
              auVar158._0_4_ = fVar305;
            }
            fVar314 = auVar158._0_4_ * 1.9073486e-06;
            fVar305 = local_118[(long)pRVar47];
            fVar311 = tp1.upper.field_0.v[(long)pRVar47];
            lVar54 = 5;
            do {
              bVar55 = lVar54 == 0;
              lVar54 = lVar54 + -1;
              if (bVar55) goto LAB_00316104;
              fVar208 = SQRT(fVar296 * fVar296 + fVar291 * fVar291 + fVar256 * fVar256) *
                        1.9073486e-06 * fVar311;
              fVar319 = 1.0 - fVar305;
              fVar228 = fVar212 * fVar319 + fVar143 * fVar305;
              fVar211 = fVar227 * fVar319 + fVar176 * fVar305;
              fVar232 = fVar231 * fVar319 + fVar207 * fVar305;
              fVar213 = fVar233 * fVar319 + fVar209 * fVar305;
              fVar323 = (local_4b8 * fVar319 + fVar212 * fVar305) * fVar319 + fVar305 * fVar228;
              fVar175 = (fStack_4b4 * fVar319 + fVar227 * fVar305) * fVar319 + fVar305 * fVar211;
              fVar177 = (fStack_4b0 * fVar319 + fVar231 * fVar305) * fVar319 + fVar305 * fVar232;
              fVar210 = (fStack_4ac * fVar319 + fVar233 * fVar305) * fVar319 + fVar305 * fVar213;
              fVar228 = fVar228 * fVar319 + (fVar143 * fVar319 + fVar132 * fVar305) * fVar305;
              fVar211 = fVar211 * fVar319 + (fVar176 * fVar319 + fVar131 * fVar305) * fVar305;
              fVar232 = fVar232 * fVar319 + (fVar207 * fVar319 + fVar133 * fVar305) * fVar305;
              fVar226 = fVar213 * fVar319 + (fVar209 * fVar319 + fVar222 * fVar305) * fVar305;
              local_4c8 = fVar319 * fVar323 + fVar305 * fVar228;
              fStack_4c4 = fVar319 * fVar175 + fVar305 * fVar211;
              fStack_4c0 = fVar319 * fVar177 + fVar305 * fVar232;
              fStack_4bc = fVar319 * fVar210 + fVar305 * fVar226;
              fVar213 = (fVar228 - fVar323) * 3.0;
              fVar223 = (fVar211 - fVar175) * 3.0;
              fVar225 = (fVar232 - fVar177) * 3.0;
              fVar226 = (fVar226 - fVar210) * 3.0;
              fVar323 = fVar319 * 6.0;
              fVar210 = (fVar305 - (fVar319 + fVar319)) * 6.0;
              fVar228 = (fVar319 - (fVar305 + fVar305)) * 6.0;
              fVar319 = fVar305 * 6.0;
              fVar175 = fVar323 * local_4b8 +
                        fVar210 * fVar212 + fVar228 * fVar143 + fVar319 * fVar132;
              fVar177 = fVar323 * fStack_4b4 +
                        fVar210 * fVar227 + fVar228 * fVar176 + fVar319 * fVar131;
              fVar323 = fVar323 * fStack_4b0 +
                        fVar210 * fVar231 + fVar228 * fVar207 + fVar319 * fVar133;
              fVar210 = (fVar311 * fVar256 + 0.0) - local_4c8;
              fVar228 = (fVar311 * fVar291 + 0.0) - fStack_4c4;
              fVar211 = (fVar311 * fVar296 + 0.0) - fStack_4c0;
              fVar232 = (fVar311 * fVar298 + 0.0) - fStack_4bc;
              fVar319 = fVar228 * fVar228;
              fStack_3a0 = fVar211 * fVar211;
              fStack_39c = fVar232 * fVar232;
              local_3a8._0_4_ = fVar319 + fVar210 * fVar210 + fStack_3a0;
              local_3a8._4_4_ = fVar319 + fVar319 + fStack_39c;
              fStack_3a0 = fVar319 + fStack_3a0 + fStack_3a0;
              fStack_39c = fVar319 + fStack_39c + fStack_39c;
              fVar319 = fVar314;
              if (fVar314 <= fVar208) {
                fVar319 = fVar208;
              }
              fVar264 = fVar223 * fVar223 + fVar213 * fVar213 + fVar225 * fVar225;
              auVar74 = ZEXT416((uint)fVar264);
              auVar259 = rsqrtss(ZEXT416((uint)fVar264),auVar74);
              fVar208 = auVar259._0_4_;
              fVar267 = fVar208 * 1.5 - fVar208 * fVar208 * fVar264 * 0.5 * fVar208;
              fVar268 = fVar213 * fVar267;
              fVar269 = fVar223 * fVar267;
              fVar272 = fVar225 * fVar267;
              fVar276 = fVar226 * fVar267;
              fVar265 = fVar225 * fVar323 + fVar223 * fVar177 + fVar213 * fVar175;
              auVar74 = rcpss(auVar74,auVar74);
              fVar208 = (2.0 - fVar264 * auVar74._0_4_) * auVar74._0_4_;
              fVar234 = fVar228 * fVar269;
              fVar235 = fVar211 * fVar272;
              fVar257 = fVar232 * fVar276;
              fVar273 = fVar234 + fVar210 * fVar268 + fVar235;
              fVar277 = fVar234 + fVar234 + fVar257;
              fVar235 = fVar234 + fVar235 + fVar235;
              fVar257 = fVar234 + fVar257 + fVar257;
              fVar270 = (SQRT((float)local_3a8._0_4_) + 1.0) * (fVar314 / SQRT(fVar264)) +
                        SQRT((float)local_3a8._0_4_) * fVar314 + fVar319;
              fVar234 = fVar276 * -fVar226;
              fVar177 = fVar272 * -fVar225 + fVar269 * -fVar223 + fVar268 * -fVar213 +
                        fVar208 * (fVar264 * fVar323 - fVar265 * fVar225) * fVar267 * fVar211 +
                        fVar208 * (fVar264 * fVar177 - fVar265 * fVar223) * fVar267 * fVar228 +
                        fVar208 * (fVar264 * fVar175 - fVar265 * fVar213) * fVar267 * fVar210;
              fVar208 = fVar296 * fVar272 + fVar291 * fVar269 + fVar256 * fVar268;
              fVar323 = (float)local_3a8._0_4_ - fVar273 * fVar273;
              auVar99._0_8_ = CONCAT44((float)local_3a8._4_4_ - fVar277 * fVar277,fVar323);
              auVar99._8_4_ = fStack_3a0 - fVar235 * fVar235;
              auVar99._12_4_ = fStack_39c - fVar257 * fVar257;
              local_5c8 = CONCAT44(fVar234,fVar177);
              auVar128._8_4_ = auVar99._8_4_;
              auVar128._0_8_ = auVar99._0_8_;
              auVar128._12_4_ = auVar99._12_4_;
              auVar74 = rsqrtss(auVar128,auVar99);
              fVar175 = auVar74._0_4_;
              fVar175 = fVar175 * 1.5 - fVar175 * fVar175 * fVar323 * 0.5 * fVar175;
              if (fVar323 < 0.0) {
                fVar323 = sqrtf(fVar323);
                pRVar47 = extraout_RAX_00;
                p_Var50 = extraout_RDX_02;
              }
              else {
                fVar323 = SQRT(fVar323);
              }
              fVar323 = fVar323 - fStack_4bc;
              fVar264 = ((-fVar225 * fVar211 + -fVar223 * fVar228 + -fVar213 * fVar210) -
                        fVar273 * fVar177) * fVar175 - fVar226;
              fVar175 = ((fVar296 * fVar211 + fVar291 * fVar228 + fVar256 * fVar210) -
                        fVar273 * fVar208) * fVar175;
              auVar171._0_4_ = (uint)fVar264 ^ (uint)DAT_01f46720;
              auVar172._4_4_ = (uint)(-fVar226 * fVar232) ^ DAT_01f46720._4_4_;
              auVar172._0_4_ = auVar171._0_4_;
              auVar159._0_4_ = fVar177 * fVar175 - fVar208 * fVar264;
              auVar172._8_4_ = auVar172._4_4_;
              auVar172._12_4_ = fVar298 * fVar232;
              auVar171._8_8_ = auVar172._8_8_;
              auVar171._4_4_ = fVar175;
              auVar159._4_4_ = auVar159._0_4_;
              auVar159._8_4_ = auVar159._0_4_;
              auVar159._12_4_ = auVar159._0_4_;
              auVar74 = divps(auVar171,auVar159);
              auVar205._8_4_ = fVar234;
              auVar205._0_8_ = local_5c8;
              auVar205._12_4_ = (uint)(fVar298 * fVar276) ^ DAT_01f46720._4_4_;
              auVar204._8_8_ = auVar205._8_8_;
              auVar204._4_4_ = (uint)fVar208 ^ (uint)DAT_01f46720;
              auVar204._0_4_ = fVar177;
              auVar259 = divps(auVar204,auVar159);
              fVar311 = fVar311 - (fVar323 * auVar259._0_4_ + fVar273 * auVar74._0_4_);
              fVar305 = fVar305 - (fVar323 * auVar259._4_4_ + fVar273 * auVar74._4_4_);
            } while ((fVar270 <= ABS(fVar273)) ||
                    (auVar244._12_4_ * 1.9073486e-06 + fVar319 + fVar270 <= ABS(fVar323)));
            fVar311 = local_318._0_4_ + fVar311;
            if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar311) &&
               (((fVar256 = (ray->super_RayK<1>).tfar, fVar311 <= fVar256 && (0.0 <= fVar305)) &&
                (fVar305 <= 1.0)))) {
              auVar74 = rsqrtss(_local_3a8,_local_3a8);
              fVar291 = auVar74._0_4_;
              pGVar9 = (context->scene->geometries).items[uVar56].ptr;
              uVar58 = (ray->super_RayK<1>).mask;
              pRVar47 = (RTCRayN *)(ulong)uVar58;
              if ((pGVar9->mask & uVar58) != 0) {
                fVar291 = fVar291 * 1.5 +
                          fVar291 * fVar291 * (float)local_3a8._0_4_ * -0.5 * fVar291;
                fVar210 = fVar210 * fVar291;
                fVar228 = fVar228 * fVar291;
                fVar211 = fVar211 * fVar291;
                fVar291 = fVar226 * fVar210 + fVar213;
                fVar296 = fVar226 * fVar228 + fVar223;
                fVar298 = fVar226 * fVar211 + fVar225;
                fVar319 = fVar228 * fVar213 - fVar223 * fVar210;
                fVar323 = fVar211 * fVar223 - fVar225 * fVar228;
                fVar175 = fVar210 * fVar225 - fVar213 * fVar211;
                fVar314 = fVar296 * fVar323 - fVar175 * fVar291;
                uVar108 = CONCAT44(fVar291 * fVar319 - fVar323 * fVar298,
                                   fVar298 * fVar175 - fVar319 * fVar296);
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  (ray->super_RayK<1>).tfar = fVar311;
                  *(undefined8 *)&(ray->Ng).field_0 = uVar108;
                  (ray->Ng).field_0.field_0.z = fVar314;
                  ray->u = fVar305;
                  ray->v = 0.0;
                  ray->primID = uVar57;
                  ray->geomID = uVar56;
                  ray->instID[0] = context->user->instID[0];
                  uVar58 = context->user->instPrimID[0];
                  ray->instPrimID[0] = uVar58;
                  pRVar47 = (RTCRayN *)(ulong)uVar58;
                }
                else {
                  vu0.field_0._0_8_ = uVar108;
                  vu0.field_0.v[2] = fVar314;
                  vu0.field_0.v[3] = fVar305;
                  (ray->super_RayK<1>).tfar = fVar311;
                  local_4fc = -1;
                  args.geometryUserPtr = pGVar9->userPtr;
                  args.valid = &local_4fc;
                  args.context = context->user;
                  args.hit = (RTCHitN *)&vu0;
                  args.N = 1;
                  args.ray = (RTCRayN *)ray;
                  if (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0031620a:
                    p_Var50 = context->args->filter;
                    if ((p_Var50 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var50)(&args);
                      p_Var50 = extraout_RDX_04;
                      if (*args.valid == 0) goto LAB_003162a5;
                    }
                    *(undefined4 *)(args.ray + 0x30) = *(undefined4 *)args.hit;
                    *(undefined4 *)(args.ray + 0x34) = *(undefined4 *)(args.hit + 4);
                    *(undefined4 *)(args.ray + 0x38) = *(undefined4 *)(args.hit + 8);
                    *(undefined4 *)(args.ray + 0x3c) = *(undefined4 *)(args.hit + 0xc);
                    *(undefined4 *)(args.ray + 0x40) = *(undefined4 *)(args.hit + 0x10);
                    *(undefined4 *)(args.ray + 0x44) = *(undefined4 *)(args.hit + 0x14);
                    *(undefined4 *)(args.ray + 0x48) = *(undefined4 *)(args.hit + 0x18);
                    p_Var50 = (RTCFilterFunctionN)(ulong)*(uint *)(args.hit + 0x1c);
                    *(uint *)(args.ray + 0x4c) = *(uint *)(args.hit + 0x1c);
                    *(undefined4 *)(args.ray + 0x50) = *(undefined4 *)(args.hit + 0x20);
                    pRVar47 = args.ray;
                  }
                  else {
                    (*pGVar9->intersectionFilterN)(&args);
                    p_Var50 = extraout_RDX_03;
                    if (*args.valid != 0) goto LAB_0031620a;
LAB_003162a5:
                    (ray->super_RayK<1>).tfar = fVar256;
                    pRVar47 = (RTCRayN *)args.valid;
                  }
                }
              }
            }
LAB_00316104:
            fVar256 = (ray->super_RayK<1>).tfar;
            auVar127._0_4_ = -(uint)(fVar266 <= fVar256) & local_348._0_4_;
            auVar127._4_4_ = -(uint)(fVar271 <= fVar256) & local_348._4_4_;
            auVar127._8_4_ = -(uint)(fVar278 <= fVar256) & local_348._8_4_;
            auVar127._12_4_ = -(uint)(fVar283 <= fVar256) & local_348._12_4_;
          }
          auVar206._0_4_ =
               local_4f8._0_4_ & local_328._0_4_ & -(uint)(local_4e8 + fVar275 <= fVar256);
          auVar206._4_4_ =
               local_4f8._4_4_ & local_328._4_4_ & -(uint)(fStack_4e4 + fVar294 <= fVar256);
          auVar206._8_4_ =
               (uint)fStack_4f0 & (uint)fStack_320 & -(uint)(fStack_4e0 + fVar308 <= fVar256);
          auVar206._12_4_ =
               (uint)fStack_4ec & (uint)fStack_31c & -(uint)(fStack_4dc + fVar251 <= fVar256);
          auVar100._0_4_ =
               auVar126._0_4_ & auVar155._0_4_ &
               -(uint)(local_4e8 + tp1.lower.field_0.v[0] <= fVar256);
          auVar100._4_4_ =
               auVar126._4_4_ & auVar155._4_4_ &
               -(uint)(fStack_4e4 + tp1.lower.field_0.v[1] <= fVar256);
          auVar100._8_4_ =
               auVar126._8_4_ & auVar155._8_4_ &
               -(uint)(fStack_4e0 + tp1.lower.field_0.v[2] <= fVar256);
          auVar100._12_4_ =
               auVar126._12_4_ & auVar155._12_4_ &
               -(uint)(fStack_4dc + tp1.lower.field_0.v[3] <= fVar256);
          uVar58 = movmskps(0,auVar100 | auVar206);
          pRVar47 = (RTCRayN *)(ulong)uVar58;
          if (uVar58 != 0) {
            pRVar47 = (RTCRayN *)((long)p_Var49 * 0x30);
            stack[(long)p_Var49].valid.field_0 =
                 (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar100 | auVar206);
            stack[(long)p_Var49].tlower.field_0.i[0] =
                 ~auVar206._0_4_ & tp1.lower.field_0.i[0] | (uint)fVar275 & auVar206._0_4_;
            stack[(long)p_Var49].tlower.field_0.i[1] =
                 ~auVar206._4_4_ & tp1.lower.field_0.i[1] | (uint)fVar294 & auVar206._4_4_;
            stack[(long)p_Var49].tlower.field_0.i[2] =
                 ~auVar206._8_4_ & tp1.lower.field_0.i[2] | (uint)fVar308 & auVar206._8_4_;
            stack[(long)p_Var49].tlower.field_0.i[3] =
                 ~auVar206._12_4_ & tp1.lower.field_0.i[3] | (uint)fVar251 & auVar206._12_4_;
            stack[(long)p_Var49].u0 = fVar144;
            stack[(long)p_Var49].u1 = fVar161;
            stack[(long)p_Var49].depth = local_60c + 1;
            p_Var49 = (RTCFilterFunctionN)(ulong)((int)p_Var49 + 1);
          }
        }
      }
    }
    fVar144 = (ray->super_RayK<1>).tfar;
    do {
      p_Var51 = p_Var49;
      iVar43 = (int)p_Var51;
      if (iVar43 == 0) {
        auVar102._4_4_ = -(uint)(fVar105 <= fVar144);
        auVar102._0_4_ = -(uint)(fVar65 <= fVar144);
        auVar102._8_4_ = -(uint)(fVar106 <= fVar144);
        auVar102._12_4_ = -(uint)(fVar107 <= fVar144);
        uVar56 = movmskps((int)pRVar47,auVar102);
        uVar56 = (uint)uVar53 & uVar56;
        goto LAB_00313f29;
      }
      p_Var49 = (RTCFilterFunctionN)(ulong)(iVar43 - 1U);
      pRVar47 = (RTCRayN *)((long)p_Var49 * 0x30);
      fVar161 = stack[(long)p_Var49].tlower.field_0.v[0];
      fVar251 = stack[(long)p_Var49].tlower.field_0.v[1];
      fVar256 = stack[(long)p_Var49].tlower.field_0.v[2];
      fVar266 = stack[(long)p_Var49].tlower.field_0.v[3];
      args.valid._0_4_ =
           -(uint)(local_4e8 + fVar161 <= fVar144) & stack[(long)p_Var49].valid.field_0.i[0];
      args.valid._4_4_ =
           -(uint)(fStack_4e4 + fVar251 <= fVar144) & stack[(long)p_Var49].valid.field_0.i[1];
      args.geometryUserPtr._0_4_ =
           -(uint)(fStack_4e0 + fVar256 <= fVar144) & stack[(long)p_Var49].valid.field_0.i[2];
      args.geometryUserPtr._4_4_ =
           -(uint)(fStack_4dc + fVar266 <= fVar144) & stack[(long)p_Var49].valid.field_0.i[3];
      uVar58 = movmskps((int)p_Var50,(undefined1  [16])args._0_16_);
      p_Var50 = (RTCFilterFunctionN)(ulong)uVar58;
    } while (uVar58 == 0);
    auVar139._0_4_ = (uint)fVar161 & (uint)args.valid;
    auVar139._4_4_ = (uint)fVar251 & args.valid._4_4_;
    auVar139._8_4_ = (uint)fVar256 & (uint)args.geometryUserPtr;
    auVar139._12_4_ = (uint)fVar266 & args.geometryUserPtr._4_4_;
    auVar160._0_8_ = CONCAT44(~args.valid._4_4_,~(uint)args.valid) & 0x7f8000007f800000;
    auVar160._8_4_ = ~(uint)args.geometryUserPtr & 0x7f800000;
    auVar160._12_4_ = ~args.geometryUserPtr._4_4_ & 0x7f800000;
    auVar160 = auVar160 | auVar139;
    auVar140._4_4_ = auVar160._0_4_;
    auVar140._0_4_ = auVar160._4_4_;
    auVar140._8_4_ = auVar160._12_4_;
    auVar140._12_4_ = auVar160._8_4_;
    auVar74 = minps(auVar140,auVar160);
    auVar129._0_8_ = auVar74._8_8_;
    auVar129._8_4_ = auVar74._0_4_;
    auVar129._12_4_ = auVar74._4_4_;
    auVar74 = minps(auVar129,auVar74);
    auVar130._0_8_ =
         CONCAT44(-(uint)(auVar74._4_4_ == auVar160._4_4_) & args.valid._4_4_,
                  -(uint)(auVar74._0_4_ == auVar160._0_4_) & (uint)args.valid);
    auVar130._8_4_ = -(uint)(auVar74._8_4_ == auVar160._8_4_) & (uint)args.geometryUserPtr;
    auVar130._12_4_ = -(uint)(auVar74._12_4_ == auVar160._12_4_) & args.geometryUserPtr._4_4_;
    iVar48 = movmskps(iVar43 - 1U,auVar130);
    auVar101 = (undefined1  [16])args._0_16_;
    if (iVar48 != 0) {
      auVar101._8_4_ = auVar130._8_4_;
      auVar101._0_8_ = auVar130._0_8_;
      auVar101._12_4_ = auVar130._12_4_;
    }
    pSVar46 = stack + (long)p_Var49;
    uVar58 = movmskps(iVar48,auVar101);
    lVar54 = 0;
    if (uVar58 != 0) {
      for (; (uVar58 >> lVar54 & 1) == 0; lVar54 = lVar54 + 1) {
      }
    }
    *(undefined4 *)((long)&args.valid + lVar54 * 4) = 0;
    uVar6 = stack[(long)p_Var49].u0;
    uVar7 = stack[(long)p_Var49].u1;
    local_60c = stack[(long)p_Var49].depth;
    iVar48 = movmskps(local_60c,(undefined1  [16])args._0_16_);
    p_Var50 = (RTCFilterFunctionN)(ulong)(iVar43 - 1);
    if (iVar48 != 0) {
      p_Var50 = p_Var51;
    }
    (pSVar46->valid).field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)args._0_16_;
    fVar144 = (float)uVar7 - (float)uVar6;
    vu0.field_0.v[1] = fVar144 * 0.33333334 + (float)uVar6;
    vu0.field_0.v[0] = fVar144 * 0.0 + (float)uVar6;
    vu0.field_0.v[2] = fVar144 * 0.6666667 + (float)uVar6;
    vu0.field_0.v[3] = fVar144 * 1.0 + (float)uVar6;
    fVar144 = vu0.field_0.v[lVar54];
    fVar161 = *(float *)((long)&vu0.field_0 + lVar54 * 4 + 4);
    p_Var49 = p_Var50;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }